

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  uchar uVar3;
  short sVar4;
  stbi_uc asVar5 [4];
  stbi_uc asVar6 [4];
  undefined8 uVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  byte bVar30;
  short sVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 z;
  undefined4 z_00;
  undefined4 z_01;
  stbi_uc sVar40;
  byte bVar41;
  int iVar42;
  stbi__uint32 sVar43;
  uint uVar44;
  int iVar45;
  stbi__jpeg *psVar46;
  byte *pbVar47;
  byte *pbVar48;
  uchar *data_00;
  float *data_01;
  stbi_uc *psVar49;
  void *pvVar50;
  code *pcVar51;
  stbi__context *psVar52;
  uchar *puVar53;
  stbi_uc *psVar54;
  long lVar55;
  long lVar56;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  int iVar57;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  int why;
  uint uVar58;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *paVar59;
  ulong extraout_RDX_02;
  stbi_uc *extraout_RDX_03;
  stbi_uc *psVar60;
  stbi_uc *extraout_RDX_04;
  stbi_uc *extraout_RDX_05;
  stbi__uint32 sVar61;
  ulong uVar62;
  stbi_uc *psVar63;
  int iVar64;
  stbi__uint32 sVar65;
  ulong uVar66;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  short *psVar67;
  int iVar68;
  uint uVar69;
  int iVar70;
  ulong uVar71;
  int *piVar72;
  ulong uVar73;
  int iVar74;
  uint uVar75;
  stbi_uc (*pasVar76) [4];
  stbi__context *psVar77;
  bool bVar78;
  undefined1 auVar79 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  stbi_uc *coutput [4];
  short data [64];
  ulong local_8970;
  uint local_8944;
  int local_8934;
  uint local_8920;
  int local_8904;
  uint local_88ec;
  undefined1 local_88e8 [12];
  uint uStack_88dc;
  undefined1 local_88d8 [16];
  ulong local_88c8;
  undefined4 local_88c0;
  uint local_88bc;
  undefined8 local_88b8;
  stbi__uint32 local_88b0;
  int local_88ac;
  stbi__gif local_88a8;
  
  psVar60 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  psVar46 = (stbi__jpeg *)malloc(0x4888);
  psVar46->s = s;
  psVar46->idct_block_kernel = stbi__idct_simd;
  psVar46->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar46->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar46->jfif = 0;
  psVar46->app14_color_transform = -1;
  psVar46->marker = 0xff;
  sVar40 = stbi__get_marker(psVar46);
  if (sVar40 != 0xd8) {
    stbi__g_failure_reason = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar46);
  if (sVar40 == 0xd8) {
    psVar46 = (stbi__jpeg *)malloc(0x4888);
    psVar46->s = s;
    psVar46->idct_block_kernel = stbi__idct_simd;
    psVar46->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar46->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      psVar46->img_comp[0].raw_data = (void *)0x0;
      psVar46->img_comp[0].raw_coeff = (void *)0x0;
      psVar46->img_comp[1].raw_data = (void *)0x0;
      psVar46->img_comp[1].raw_coeff = (void *)0x0;
      psVar46->img_comp[2].raw_data = (void *)0x0;
      psVar46->img_comp[2].raw_coeff = (void *)0x0;
      psVar46->img_comp[3].raw_data = (void *)0x0;
      psVar46->img_comp[3].raw_coeff = (void *)0x0;
      psVar46->restart_interval = 0;
      iVar42 = stbi__decode_jpeg_header(psVar46,0);
      uVar75 = extraout_EDX;
      if (iVar42 != 0) {
        paVar1 = psVar46->img_comp;
        bVar41 = stbi__get_marker(psVar46);
LAB_00121dfa:
        if (bVar41 == 0xda) {
          iVar42 = stbi__get16be(psVar46->s);
          psVar52 = psVar46->s;
          pbVar48 = psVar52->img_buffer;
          paVar59 = extraout_RDX_00;
          if (psVar52->img_buffer_end <= pbVar48) {
            if (psVar52->read_from_callbacks != 0) {
              psVar60 = psVar52->buffer_start;
              iVar70 = (*(psVar52->io).read)(psVar52->io_user_data,(char *)psVar60,psVar52->buflen);
              if (iVar70 == 0) {
                psVar52->read_from_callbacks = 0;
                psVar63 = psVar52->buffer_start + 1;
                psVar52->buffer_start[0] = '\0';
                bVar41 = 0;
              }
              else {
                psVar63 = psVar60 + iVar70;
                bVar41 = *psVar60;
              }
              psVar52->img_buffer_end = psVar63;
              psVar52->img_buffer = psVar52->buffer_start + 1;
              paVar59 = extraout_RDX_01;
              goto LAB_00121ee9;
            }
            psVar46->scan_n = 0;
LAB_00123a84:
            stbi__g_failure_reason = "bad SOS component count";
            goto LAB_00123a8b;
          }
          psVar52->img_buffer = pbVar48 + 1;
          bVar41 = *pbVar48;
LAB_00121ee9:
          uVar75 = (uint)bVar41;
          psVar46->scan_n = uVar75;
          if (((byte)(bVar41 - 5) < 0xfc) || (psVar52 = psVar46->s, psVar52->img_n < (int)uVar75))
          goto LAB_00123a84;
          if (iVar42 != uVar75 * 2 + 6) {
            stbi__g_failure_reason = "bad SOS len";
            goto LAB_00123a8b;
          }
          lVar56 = 0;
          do {
            pbVar47 = psVar52->img_buffer;
            pbVar48 = psVar52->img_buffer_end;
            if (pbVar47 < pbVar48) {
              psVar52->img_buffer = pbVar47 + 1;
              uVar69 = (uint)*pbVar47;
              pbVar47 = pbVar47 + 1;
            }
            else if (psVar52->read_from_callbacks == 0) {
              uVar69 = 0;
            }
            else {
              psVar60 = psVar52->buffer_start;
              iVar42 = (*(psVar52->io).read)(psVar52->io_user_data,(char *)psVar60,psVar52->buflen);
              if (iVar42 == 0) {
                psVar52->read_from_callbacks = 0;
                psVar63 = psVar52->buffer_start + 1;
                psVar52->buffer_start[0] = '\0';
                uVar69 = 0;
              }
              else {
                psVar63 = psVar60 + iVar42;
                uVar69 = (uint)*psVar60;
              }
              psVar52->img_buffer_end = psVar63;
              psVar52->img_buffer = psVar52->buffer_start + 1;
              psVar52 = psVar46->s;
              pbVar47 = psVar52->img_buffer;
              pbVar48 = psVar52->img_buffer_end;
            }
            if (pbVar47 < pbVar48) {
              psVar52->img_buffer = pbVar47 + 1;
              uVar44 = (uint)*pbVar47;
            }
            else if (psVar52->read_from_callbacks == 0) {
              uVar44 = 0;
            }
            else {
              psVar60 = psVar52->buffer_start;
              iVar42 = (*(psVar52->io).read)(psVar52->io_user_data,(char *)psVar60,psVar52->buflen);
              if (iVar42 == 0) {
                psVar52->read_from_callbacks = 0;
                psVar63 = psVar52->buffer_start + 1;
                psVar52->buffer_start[0] = '\0';
                uVar44 = 0;
              }
              else {
                psVar63 = psVar60 + iVar42;
                uVar44 = (uint)*psVar60;
              }
              psVar52->img_buffer_end = psVar63;
              psVar52->img_buffer = psVar52->buffer_start + 1;
              psVar52 = psVar46->s;
            }
            uVar75 = psVar52->img_n;
            if ((long)(int)uVar75 < 1) {
              uVar73 = 0;
            }
            else {
              uVar73 = 0;
              paVar59 = paVar1;
              while (paVar59->id != uVar69) {
                uVar73 = uVar73 + 1;
                paVar59 = paVar59 + 1;
                if ((long)(int)uVar75 == uVar73) goto LAB_00123a92;
              }
            }
            if ((uint)uVar73 == uVar75) goto LAB_00123a92;
            uVar66 = uVar73 & 0xffffffff;
            paVar59 = (anon_struct_96_18_0d0905d3 *)(uVar66 * 0x60);
            psVar46->img_comp[uVar66].hd = uVar44 >> 4;
            if (0x3f < (byte)uVar44) {
              stbi__g_failure_reason = "bad DC huff";
              goto LAB_00123a8b;
            }
            paVar59 = paVar1 + uVar66;
            paVar59->ha = uVar44 & 0xf;
            if (3 < (uVar44 & 0xf)) {
              stbi__g_failure_reason = "bad AC huff";
              goto LAB_00123a8b;
            }
            psVar46->order[lVar56] = (uint)uVar73;
            lVar56 = lVar56 + 1;
          } while (lVar56 < psVar46->scan_n);
          pbVar48 = psVar52->img_buffer;
          pbVar47 = psVar52->img_buffer_end;
          if (pbVar48 < pbVar47) {
            psVar52->img_buffer = pbVar48 + 1;
            bVar41 = *pbVar48;
            pbVar48 = pbVar48 + 1;
          }
          else if (psVar52->read_from_callbacks == 0) {
            bVar41 = 0;
          }
          else {
            psVar60 = psVar52->buffer_start;
            iVar42 = (*(psVar52->io).read)(psVar52->io_user_data,(char *)psVar60,psVar52->buflen);
            if (iVar42 == 0) {
              psVar52->read_from_callbacks = 0;
              psVar63 = psVar52->buffer_start + 1;
              psVar52->buffer_start[0] = '\0';
              bVar41 = 0;
            }
            else {
              psVar63 = psVar60 + iVar42;
              bVar41 = *psVar60;
            }
            psVar52->img_buffer_end = psVar63;
            psVar52->img_buffer = psVar52->buffer_start + 1;
            psVar52 = psVar46->s;
            pbVar48 = psVar52->img_buffer;
            pbVar47 = psVar52->img_buffer_end;
          }
          psVar46->spec_start = (uint)bVar41;
          if (pbVar48 < pbVar47) {
            psVar52->img_buffer = pbVar48 + 1;
            uVar75 = (uint)*pbVar48;
            pbVar48 = pbVar48 + 1;
          }
          else if (psVar52->read_from_callbacks == 0) {
            uVar75 = 0;
          }
          else {
            psVar60 = psVar52->buffer_start;
            iVar42 = (*(psVar52->io).read)(psVar52->io_user_data,(char *)psVar60,psVar52->buflen);
            if (iVar42 == 0) {
              psVar52->read_from_callbacks = 0;
              psVar63 = psVar52->buffer_start + 1;
              psVar52->buffer_start[0] = '\0';
              uVar75 = 0;
            }
            else {
              psVar63 = psVar60 + iVar42;
              uVar75 = (uint)*psVar60;
            }
            psVar52->img_buffer_end = psVar63;
            psVar52->img_buffer = psVar52->buffer_start + 1;
            psVar52 = psVar46->s;
            pbVar48 = psVar52->img_buffer;
            pbVar47 = psVar52->img_buffer_end;
          }
          psVar46->spec_end = uVar75;
          if (pbVar48 < pbVar47) {
            psVar52->img_buffer = pbVar48 + 1;
            uVar75 = (uint)*pbVar48;
          }
          else if (psVar52->read_from_callbacks == 0) {
            uVar75 = 0;
          }
          else {
            psVar60 = psVar52->buffer_start;
            iVar42 = (*(psVar52->io).read)(psVar52->io_user_data,(char *)psVar60,psVar52->buflen);
            if (iVar42 == 0) {
              psVar52->read_from_callbacks = 0;
              psVar63 = psVar52->buffer_start + 1;
              psVar52->buffer_start[0] = '\0';
              uVar75 = 0;
            }
            else {
              psVar63 = psVar60 + iVar42;
              uVar75 = (uint)*psVar60;
            }
            psVar52->img_buffer_end = psVar63;
            psVar52->img_buffer = psVar52->buffer_start + 1;
          }
          psVar46->succ_high = uVar75 >> 4;
          uVar69 = uVar75 & 0xf;
          paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar69;
          psVar46->succ_low = uVar69;
          iVar42 = psVar46->progressive;
          iVar70 = psVar46->spec_start;
          if (iVar42 == 0) {
            if ((iVar70 != 0) || ((0xf < (byte)uVar75 || (uVar69 != 0)))) {
LAB_001243a3:
              stbi__g_failure_reason = "bad SOS";
              goto LAB_00123a8b;
            }
            psVar46->spec_end = 0x3f;
          }
          else if ((((0x3f < iVar70) || (0x3f < psVar46->spec_end)) || (psVar46->spec_end < iVar70))
                  || ((0xdf < (byte)uVar75 || (0xd < uVar69)))) goto LAB_001243a3;
          uVar75 = psVar46->scan_n;
          uVar73 = (ulong)uVar75;
          iVar70 = psVar46->restart_interval;
          if (iVar70 == 0) {
            iVar70 = 0x7fffffff;
          }
          psVar46->code_buffer = 0;
          psVar46->code_bits = 0;
          psVar46->nomore = 0;
          psVar46->img_comp[3].dc_pred = 0;
          psVar46->img_comp[2].dc_pred = 0;
          psVar46->img_comp[1].dc_pred = 0;
          psVar46->img_comp[0].dc_pred = 0;
          psVar46->marker = 0xff;
          psVar46->todo = iVar70;
          psVar46->eob_run = 0;
          if (iVar42 == 0) {
            if (uVar75 == 1) {
              iVar42 = psVar46->order[0];
              iVar70 = psVar46->img_comp[iVar42].y + 7 >> 3;
              bVar78 = true;
              uVar75 = 1;
              if (0 < iVar70) {
                uVar69 = paVar1[iVar42].x + 7 >> 3;
                iVar57 = 0;
                iVar68 = 0;
                do {
                  if (0 < (int)uVar69) {
                    lVar56 = 0;
                    do {
                      iVar64 = stbi__jpeg_decode_block
                                         (psVar46,(short *)&local_88a8,
                                          (stbi__huffman *)psVar46->huff_dc[paVar1[iVar42].hd].fast,
                                          (stbi__huffman *)psVar46->huff_ac[paVar1[iVar42].ha].fast,
                                          psVar46->fast_ac[paVar1[iVar42].ha],iVar42,
                                          psVar46->dequant[paVar1[iVar42].tq]);
                      uVar75 = extraout_EDX_02;
                      if (iVar64 == 0) goto LAB_00123157;
                      (*psVar46->idct_block_kernel)
                                (paVar1[iVar42].data + lVar56 + iVar57 * paVar1[iVar42].w2,
                                 paVar1[iVar42].w2,(short *)&local_88a8);
                      uVar75 = (uint)extraout_RDX_02;
                      iVar64 = psVar46->todo;
                      psVar46->todo = iVar64 + -1;
                      uVar73 = extraout_RDX_02;
                      if (iVar64 < 2) {
                        if (psVar46->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar46);
                          uVar75 = extraout_EDX_03;
                        }
                        if ((psVar46->marker & 0xf8) != 0xd0) goto LAB_00122d4e;
                        psVar46->code_buffer = 0;
                        psVar46->code_bits = 0;
                        psVar46->nomore = 0;
                        psVar46->img_comp[3].dc_pred = 0;
                        psVar46->img_comp[2].dc_pred = 0;
                        psVar46->img_comp[1].dc_pred = 0;
                        psVar46->img_comp[0].dc_pred = 0;
                        psVar46->marker = 0xff;
                        iVar64 = psVar46->restart_interval;
                        uVar73 = 0x7fffffff;
                        if (iVar64 == 0) {
                          iVar64 = 0x7fffffff;
                        }
                        psVar46->todo = iVar64;
                        psVar46->eob_run = 0;
                      }
                      lVar56 = lVar56 + 8;
                    } while ((ulong)uVar69 * 8 != lVar56);
                  }
                  uVar75 = (uint)uVar73;
                  iVar68 = iVar68 + 1;
                  iVar57 = iVar57 + 8;
                } while (iVar68 != iVar70);
LAB_00122d4e:
                bVar78 = true;
              }
            }
            else {
              uVar75 = psVar46->img_mcu_y;
              uVar73 = (ulong)uVar75;
              bVar78 = true;
              if (0 < (int)uVar75) {
                iVar42 = psVar46->img_mcu_x;
                iVar68 = 0;
                do {
                  if (0 < iVar42) {
                    uVar69 = 0;
                    do {
                      iVar42 = psVar46->scan_n;
                      if (0 < iVar42) {
                        uVar73 = 0;
                        do {
                          iVar70 = psVar46->order[uVar73];
                          iVar57 = psVar46->img_comp[iVar70].v;
                          if (0 < iVar57) {
                            iVar42 = paVar1[iVar70].h;
                            iVar64 = 0;
                            local_88c8 = uVar73;
                            do {
                              if (0 < iVar42) {
                                iVar57 = 0;
                                do {
                                  iVar74 = paVar1[iVar70].v;
                                  iVar45 = stbi__jpeg_decode_block
                                                     (psVar46,(short *)&local_88a8,
                                                      (stbi__huffman *)
                                                      psVar46->huff_dc[paVar1[iVar70].hd].fast,
                                                      (stbi__huffman *)
                                                      psVar46->huff_ac[paVar1[iVar70].ha].fast,
                                                      psVar46->fast_ac[paVar1[iVar70].ha],iVar70,
                                                      psVar46->dequant[paVar1[iVar70].tq]);
                                  uVar75 = extraout_EDX_05;
                                  if (iVar45 == 0) goto LAB_00123157;
                                  (*psVar46->idct_block_kernel)
                                            (paVar1[iVar70].data +
                                             (long)(int)((iVar42 * uVar69 + iVar57) * 8) +
                                             (long)((iVar74 * iVar68 + iVar64) * paVar1[iVar70].w2 *
                                                   8),paVar1[iVar70].w2,(short *)&local_88a8);
                                  iVar57 = iVar57 + 1;
                                  iVar42 = paVar1[iVar70].h;
                                } while (iVar57 < iVar42);
                                iVar57 = paVar1[iVar70].v;
                              }
                              iVar64 = iVar64 + 1;
                            } while (iVar64 < iVar57);
                            iVar42 = psVar46->scan_n;
                            uVar73 = local_88c8;
                          }
                          uVar73 = uVar73 + 1;
                        } while ((long)uVar73 < (long)iVar42);
                        iVar70 = psVar46->todo;
                      }
                      uVar75 = (uint)uVar73;
                      bVar78 = true;
                      psVar46->todo = iVar70 + -1;
                      bVar8 = iVar70 < 2;
                      iVar70 = iVar70 + -1;
                      if (bVar8) {
                        if (psVar46->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar46);
                          uVar75 = extraout_EDX_06;
                        }
                        if ((psVar46->marker & 0xf8) != 0xd0) goto LAB_00123159;
                        psVar46->code_buffer = 0;
                        psVar46->code_bits = 0;
                        psVar46->nomore = 0;
                        psVar46->img_comp[3].dc_pred = 0;
                        psVar46->img_comp[2].dc_pred = 0;
                        psVar46->img_comp[1].dc_pred = 0;
                        psVar46->img_comp[0].dc_pred = 0;
                        psVar46->marker = 0xff;
                        iVar70 = psVar46->restart_interval;
                        if (iVar70 == 0) {
                          iVar70 = 0x7fffffff;
                        }
                        psVar46->todo = iVar70;
                        psVar46->eob_run = 0;
                      }
                      uVar69 = uVar69 + 1;
                      uVar73 = (ulong)uVar69;
                      iVar42 = psVar46->img_mcu_x;
                    } while ((int)uVar69 < iVar42);
                    uVar73 = (ulong)(uint)psVar46->img_mcu_y;
                  }
                  bVar78 = true;
                  iVar68 = iVar68 + 1;
                  uVar75 = (uint)uVar73;
                } while (iVar68 < (int)uVar75);
              }
            }
            goto LAB_00123159;
          }
          if (uVar75 == 1) {
            iVar42 = psVar46->order[0];
            iVar70 = psVar46->img_comp[iVar42].y + 7 >> 3;
            if (0 < iVar70) {
              local_88b8 = paVar1 + iVar42;
              iVar68 = psVar46->img_comp[iVar42].x + 7 >> 3;
              local_8934 = 0;
              do {
                if (0 < iVar68) {
                  iVar57 = 0;
                  do {
                    psVar67 = local_88b8->coeff + (local_88b8->coeff_w * local_8934 + iVar57) * 0x40
                    ;
                    uVar73 = (ulong)psVar46->spec_start;
                    local_88c8 = CONCAT44(local_88c8._4_4_,iVar57);
                    if (uVar73 == 0) {
                      iVar57 = stbi__jpeg_decode_block_prog_dc
                                         (psVar46,psVar67,
                                          (stbi__huffman *)psVar46->huff_dc[local_88b8->hd].fast,
                                          iVar42);
                      uVar75 = extraout_EDX_01;
                      if (iVar57 == 0) goto LAB_00123a92;
                    }
                    else {
                      iVar57 = local_88b8->ha;
                      iVar64 = psVar46->eob_run;
                      bVar41 = (byte)psVar46->succ_low;
                      if (psVar46->succ_high == 0) {
                        if (iVar64 == 0) {
                          paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar46->code_bits;
                          do {
                            if ((int)paVar59 < 0x10) {
                              stbi__grow_buffer_unsafe(psVar46);
                            }
                            uVar75 = psVar46->code_buffer;
                            uVar66 = (ulong)(uVar75 >> 0x17);
                            sVar4 = psVar46->fast_ac[iVar57][uVar66];
                            uVar69 = (uint)sVar4;
                            iVar64 = (int)uVar73;
                            if (sVar4 == 0) {
                              if (psVar46->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar46);
                                uVar75 = psVar46->code_buffer;
                                uVar66 = (ulong)(uVar75 >> 0x17);
                              }
                              uVar73 = (ulong)psVar46->huff_ac[iVar57].fast[uVar66];
                              if (uVar73 == 0xff) {
                                lVar56 = 0;
                                do {
                                  lVar55 = lVar56;
                                  lVar56 = lVar55 + 1;
                                } while (psVar46->huff_ac[iVar57].maxcode[lVar55 + 10] <=
                                         uVar75 >> 0x10);
                                uVar69 = psVar46->code_bits;
                                paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar69;
                                if (lVar56 == 8) goto LAB_001250fe;
                                if ((int)uVar69 < (int)(lVar55 + 10)) goto LAB_00125108;
                                uVar73 = (ulong)(int)((uVar75 >> (0x17U - (char)lVar56 & 0x1f) &
                                                      stbi__bmask[lVar55 + 10]) +
                                                     psVar46->huff_ac[iVar57].delta[lVar55 + 10]);
                                bVar2 = psVar46->huff_ac[iVar57].size[uVar73];
                                if ((uVar75 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                    (uint)psVar46->huff_ac[iVar57].code[uVar73]) goto LAB_00125744;
                                uVar69 = (uVar69 - (int)lVar56) - 9;
                                paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar69;
                                psVar46->code_bits = uVar69;
                                sVar43 = uVar75 << ((byte)(lVar55 + 10) & 0x1f);
                                psVar46->code_buffer = sVar43;
                              }
                              else {
                                bVar2 = psVar46->huff_ac[iVar57].size[uVar73];
                                uVar69 = psVar46->code_bits - (uint)bVar2;
                                paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar69;
                                if (psVar46->code_bits < (int)(uint)bVar2) goto LAB_00125108;
                                sVar43 = uVar75 << (bVar2 & 0x1f);
                                psVar46->code_buffer = sVar43;
                                psVar46->code_bits = uVar69;
                              }
                              bVar2 = psVar46->huff_ac[iVar57].values[uVar73];
                              uVar75 = bVar2 & 0xf;
                              bVar30 = bVar2 >> 4;
                              uVar69 = (uint)bVar30;
                              iVar74 = (int)paVar59;
                              if ((bVar2 & 0xf) == 0) {
                                if (bVar2 < 0xf0) {
                                  iVar64 = 1 << bVar30;
                                  psVar46->eob_run = iVar64;
                                  if (0xf < bVar2) {
                                    if (iVar74 < (int)uVar69) {
                                      stbi__grow_buffer_unsafe(psVar46);
                                      sVar43 = psVar46->code_buffer;
                                      iVar74 = psVar46->code_bits;
                                      iVar64 = psVar46->eob_run;
                                    }
                                    uVar44 = sVar43 << bVar30 | sVar43 >> 0x20 - bVar30;
                                    uVar75 = stbi__bmask[uVar69];
                                    psVar46->code_buffer = ~uVar75 & uVar44;
                                    iVar64 = iVar64 + (uVar44 & uVar75);
                                    psVar46->code_bits = iVar74 - uVar69;
                                  }
                                  goto LAB_001224fd;
                                }
                                uVar75 = iVar64 + 0x10;
                              }
                              else {
                                lVar56 = (long)iVar64 + (ulong)uVar69;
                                bVar2 = ""[lVar56];
                                if (iVar74 < (int)uVar75) {
                                  stbi__grow_buffer_unsafe(psVar46);
                                  sVar43 = psVar46->code_buffer;
                                  iVar74 = psVar46->code_bits;
                                }
                                uVar44 = sVar43 << (sbyte)uVar75 | sVar43 >> 0x20 - (sbyte)uVar75;
                                uVar69 = *(uint *)((long)stbi__bmask + (ulong)(uVar75 * 4));
                                psVar46->code_buffer = ~uVar69 & uVar44;
                                paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar74 - uVar75);
                                psVar46->code_bits = iVar74 - uVar75;
                                iVar64 = 0;
                                if (-1 < (int)sVar43) {
                                  iVar64 = *(int *)((long)stbi__jbias + (ulong)(uVar75 * 4));
                                }
                                uVar75 = (int)lVar56 + 1;
                                psVar67[bVar2] =
                                     (short)((uVar44 & uVar69) + iVar64 << (bVar41 & 0x1f));
                              }
                            }
                            else {
                              lVar56 = (long)iVar64 + (ulong)(uVar69 >> 4 & 0xf);
                              psVar46->code_buffer = uVar75 << (sbyte)(uVar69 & 0xf);
                              uVar75 = psVar46->code_bits - (uVar69 & 0xf);
                              paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar75;
                              psVar46->code_bits = uVar75;
                              uVar75 = (int)lVar56 + 1;
                              psVar67[""[lVar56]] = (short)((uVar69 >> 8) << (bVar41 & 0x1f));
                            }
                            uVar73 = (ulong)uVar75;
                          } while ((int)uVar75 <= psVar46->spec_end);
                        }
                        else {
LAB_001224fd:
                          psVar46->eob_run = iVar64 + -1;
                        }
                      }
                      else if (iVar64 == 0) {
                        iVar64 = 0x10000 << (bVar41 & 0x1f);
                        paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar46->code_bits;
                        do {
                          if ((int)paVar59 < 0x10) {
                            stbi__grow_buffer_unsafe(psVar46);
                          }
                          uVar75 = psVar46->code_buffer;
                          uVar66 = (ulong)psVar46->huff_ac[iVar57].fast[uVar75 >> 0x17];
                          if (uVar66 == 0xff) {
                            lVar56 = 0;
                            do {
                              lVar55 = lVar56;
                              lVar56 = lVar55 + 1;
                            } while (psVar46->huff_ac[iVar57].maxcode[lVar55 + 10] <= uVar75 >> 0x10
                                    );
                            uVar69 = psVar46->code_bits;
                            paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar69;
                            if (lVar56 == 8) goto LAB_001250fe;
                            if ((int)uVar69 < (int)(lVar55 + 10)) goto LAB_00125108;
                            uVar66 = (ulong)(int)((uVar75 >> (0x17U - (char)lVar56 & 0x1f) &
                                                  stbi__bmask[lVar55 + 10]) +
                                                 psVar46->huff_ac[iVar57].delta[lVar55 + 10]);
                            bVar2 = psVar46->huff_ac[iVar57].size[uVar66];
                            if ((uVar75 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                (uint)psVar46->huff_ac[iVar57].code[uVar66]) {
LAB_00125744:
                              __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/dcoeurjo[P]axisampling/stb_image.h"
                                            ,0x7a0,
                                            "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                           );
                            }
                            uVar69 = (uVar69 - (int)lVar56) - 9;
                            paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar69;
                            psVar46->code_bits = uVar69;
                            sVar43 = uVar75 << ((byte)(lVar55 + 10) & 0x1f);
                            psVar46->code_buffer = sVar43;
                          }
                          else {
                            bVar2 = psVar46->huff_ac[iVar57].size[uVar66];
                            uVar69 = psVar46->code_bits - (uint)bVar2;
                            paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar69;
                            if (psVar46->code_bits < (int)(uint)bVar2) goto LAB_00125108;
                            sVar43 = uVar75 << (bVar2 & 0x1f);
                            psVar46->code_buffer = sVar43;
                            psVar46->code_bits = uVar69;
                          }
                          iVar74 = (int)paVar59;
                          bVar2 = psVar46->huff_ac[iVar57].values[uVar66];
                          bVar30 = bVar2 >> 4;
                          uVar75 = (uint)bVar30;
                          uVar66 = (ulong)uVar75;
                          if ((bVar2 & 0xf) == 1) {
                            if (iVar74 < 1) {
                              stbi__grow_buffer_unsafe(psVar46);
                              sVar43 = psVar46->code_buffer;
                              iVar74 = psVar46->code_bits;
                            }
                            sVar65 = sVar43 * 2;
                            psVar46->code_buffer = sVar65;
                            paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar74 - 1U);
                            local_8944._0_2_ =
                                 (short)(((int)~sVar43 >> 0x1f | 1U) << (bVar41 & 0x1f));
                            psVar46->code_bits = iVar74 - 1U;
                          }
                          else {
                            if ((bVar2 & 0xf) != 0) goto LAB_00125108;
                            if (bVar2 < 0xf0) {
                              uVar69 = ~(-1 << bVar30);
                              psVar46->eob_run = uVar69;
                              uVar71 = 0x40;
                              if (0xf < bVar2) {
                                if (iVar74 < (int)uVar75) {
                                  stbi__grow_buffer_unsafe(psVar46);
                                  sVar43 = psVar46->code_buffer;
                                  iVar74 = psVar46->code_bits;
                                  uVar69 = psVar46->eob_run;
                                }
                                uVar58 = sVar43 << bVar30 | sVar43 >> 0x20 - bVar30;
                                uVar44 = stbi__bmask[uVar66];
                                sVar65 = ~uVar44 & uVar58;
                                psVar46->code_buffer = sVar65;
                                paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar74 - uVar75);
                                psVar46->code_bits = iVar74 - uVar75;
                                psVar46->eob_run = (uVar58 & uVar44) + uVar69;
                                local_8944._0_2_ = 0;
                                uVar66 = uVar71;
                                goto LAB_0012273a;
                              }
                            }
                            else {
                              uVar71 = 0xf;
                            }
                            local_8944._0_2_ = 0;
                            uVar66 = uVar71;
                            sVar65 = sVar43;
                          }
LAB_0012273a:
                          uVar75 = psVar46->spec_end;
                          uVar71 = (ulong)uVar75;
                          if ((int)uVar73 <= (int)uVar75) {
                            uVar62 = (long)(int)uVar73;
                            do {
                              uVar75 = (uint)uVar71;
                              iVar74 = (int)paVar59;
                              bVar2 = ""[uVar62];
                              if (psVar67[bVar2] == 0) {
                                if ((int)uVar66 == 0) {
                                  uVar73 = (ulong)((int)uVar62 + 1);
                                  psVar67[bVar2] = (short)local_8944;
                                  break;
                                }
                                uVar66 = (ulong)((int)uVar66 - 1);
                              }
                              else {
                                if (iVar74 < 1) {
                                  stbi__grow_buffer_unsafe(psVar46);
                                  sVar65 = psVar46->code_buffer;
                                  iVar74 = psVar46->code_bits;
                                }
                                sVar43 = sVar65 * 2;
                                psVar46->code_buffer = sVar43;
                                paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar74 - 1U);
                                psVar46->code_bits = iVar74 - 1U;
                                bVar78 = (int)sVar65 < 0;
                                sVar65 = sVar43;
                                if ((bVar78) &&
                                   (sVar4 = psVar67[bVar2], (iVar64 >> 0x10 & (int)sVar4) == 0)) {
                                  sVar31 = (short)((uint)iVar64 >> 0x10);
                                  if (sVar4 < 1) {
                                    sVar31 = -sVar31;
                                  }
                                  psVar67[bVar2] = sVar4 + sVar31;
                                }
                              }
                              uVar73 = uVar62 + 1;
                              uVar75 = psVar46->spec_end;
                              uVar71 = (ulong)(int)uVar75;
                              bVar78 = (long)uVar62 < (long)uVar71;
                              uVar62 = uVar73;
                            } while (bVar78);
                          }
                        } while ((int)uVar73 <= (int)uVar75);
                      }
                      else {
                        psVar46->eob_run = iVar64 + -1;
                        if (psVar46->spec_start <= psVar46->spec_end) {
                          uVar75 = (0x10000 << (bVar41 & 0x1f)) >> 0x10;
                          do {
                            bVar41 = ""[uVar73];
                            if (psVar67[bVar41] != 0) {
                              iVar57 = psVar46->code_bits;
                              if (iVar57 < 1) {
                                stbi__grow_buffer_unsafe(psVar46);
                                iVar57 = psVar46->code_bits;
                              }
                              sVar43 = psVar46->code_buffer;
                              psVar46->code_buffer = sVar43 * 2;
                              psVar46->code_bits = iVar57 + -1;
                              if (((int)sVar43 < 0) &&
                                 (sVar4 = psVar67[bVar41], (uVar75 & (int)sVar4) == 0)) {
                                uVar69 = -uVar75;
                                if (0 < sVar4) {
                                  uVar69 = uVar75;
                                }
                                psVar67[bVar41] = (short)uVar69 + sVar4;
                              }
                            }
                            bVar78 = (long)uVar73 < (long)psVar46->spec_end;
                            uVar73 = uVar73 + 1;
                          } while (bVar78);
                        }
                      }
                    }
                    iVar57 = psVar46->todo;
                    psVar46->todo = iVar57 + -1;
                    if (iVar57 < 2) {
                      if (psVar46->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar46);
                      }
                      bVar41 = psVar46->marker;
                      if ((bVar41 & 0xf8) != 0xd0) goto LAB_00123171;
                      psVar46->code_buffer = 0;
                      psVar46->code_bits = 0;
                      psVar46->nomore = 0;
                      psVar46->img_comp[3].dc_pred = 0;
                      psVar46->img_comp[2].dc_pred = 0;
                      psVar46->img_comp[1].dc_pred = 0;
                      psVar46->img_comp[0].dc_pred = 0;
                      psVar46->marker = 0xff;
                      iVar57 = psVar46->restart_interval;
                      if (iVar57 == 0) {
                        iVar57 = 0x7fffffff;
                      }
                      psVar46->todo = iVar57;
                      psVar46->eob_run = 0;
                    }
                    iVar57 = (int)local_88c8 + 1;
                  } while (iVar57 != iVar68);
                }
                local_8934 = local_8934 + 1;
              } while (local_8934 != iVar70);
            }
          }
          else {
            iVar42 = psVar46->img_mcu_y;
            if (0 < iVar42) {
              iVar68 = psVar46->img_mcu_x;
              iVar57 = 0;
              do {
                if (0 < iVar68) {
                  iVar42 = 0;
                  do {
                    iVar68 = psVar46->scan_n;
                    if (0 < iVar68) {
                      lVar56 = 0;
                      do {
                        iVar70 = psVar46->order[lVar56];
                        iVar64 = psVar46->img_comp[iVar70].v;
                        if (0 < iVar64) {
                          iVar68 = paVar1[iVar70].h;
                          iVar74 = 0;
                          do {
                            if (0 < iVar68) {
                              iVar64 = 0;
                              do {
                                iVar68 = stbi__jpeg_decode_block_prog_dc
                                                   (psVar46,paVar1[iVar70].coeff +
                                                            (iVar68 * iVar42 + iVar64 +
                                                            (paVar1[iVar70].v * iVar57 + iVar74) *
                                                            paVar1[iVar70].coeff_w) * 0x40,
                                                    (stbi__huffman *)
                                                    psVar46->huff_dc[paVar1[iVar70].hd].fast,iVar70)
                                ;
                                uVar75 = extraout_EDX_04;
                                if (iVar68 == 0) goto LAB_00123a92;
                                iVar64 = iVar64 + 1;
                                iVar68 = paVar1[iVar70].h;
                              } while (iVar64 < iVar68);
                              iVar64 = paVar1[iVar70].v;
                            }
                            iVar74 = iVar74 + 1;
                          } while (iVar74 < iVar64);
                          iVar68 = psVar46->scan_n;
                        }
                        lVar56 = lVar56 + 1;
                      } while (lVar56 < iVar68);
                      iVar70 = psVar46->todo;
                    }
                    psVar46->todo = iVar70 + -1;
                    bVar78 = iVar70 < 2;
                    iVar70 = iVar70 + -1;
                    if (bVar78) {
                      if (psVar46->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar46);
                      }
                      bVar41 = psVar46->marker;
                      if ((bVar41 & 0xf8) != 0xd0) goto LAB_00123171;
                      psVar46->code_buffer = 0;
                      psVar46->code_bits = 0;
                      psVar46->nomore = 0;
                      psVar46->img_comp[3].dc_pred = 0;
                      psVar46->img_comp[2].dc_pred = 0;
                      psVar46->img_comp[1].dc_pred = 0;
                      psVar46->img_comp[0].dc_pred = 0;
                      psVar46->marker = 0xff;
                      iVar70 = psVar46->restart_interval;
                      if (iVar70 == 0) {
                        iVar70 = 0x7fffffff;
                      }
                      psVar46->todo = iVar70;
                      psVar46->eob_run = 0;
                    }
                    iVar42 = iVar42 + 1;
                    iVar68 = psVar46->img_mcu_x;
                  } while (iVar42 < iVar68);
                  iVar42 = psVar46->img_mcu_y;
                }
                iVar57 = iVar57 + 1;
              } while (iVar57 < iVar42);
            }
          }
          goto LAB_00123166;
        }
        uVar75 = (uint)bVar41;
        if (uVar75 == 0xdc) {
          iVar42 = stbi__get16be(psVar46->s);
          sVar43 = stbi__get16be(psVar46->s);
          paVar59 = extraout_RDX;
          if (iVar42 == 4) {
            if (sVar43 == psVar46->s->img_y) goto LAB_00121e50;
            stbi__g_failure_reason = "bad DNL height";
          }
          else {
            stbi__g_failure_reason = "bad DNL len";
          }
          goto LAB_00123a8b;
        }
        if (uVar75 == 0xd9) {
          psVar77 = psVar46->s;
          uVar75 = psVar77->img_n;
          if (psVar46->progressive == 0) goto LAB_0012393b;
          if ((int)uVar75 < 1) {
            uVar69 = req_comp + (uint)(req_comp == 0);
            bVar78 = false;
          }
          else {
            lVar56 = 0;
            do {
              iVar42 = psVar46->img_comp[lVar56].y + 7 >> 3;
              if (0 < iVar42) {
                uVar75 = paVar1[lVar56].x + 7 >> 3;
                iVar70 = 0;
                do {
                  if (0 < (int)uVar75) {
                    uVar73 = 0;
                    do {
                      psVar67 = paVar1[lVar56].coeff +
                                (paVar1[lVar56].coeff_w * iVar70 + (int)uVar73) * 0x40;
                      iVar68 = paVar1[lVar56].tq;
                      lVar55 = 0;
                      do {
                        psVar67[lVar55] = psVar67[lVar55] * psVar46->dequant[iVar68][lVar55];
                        lVar55 = lVar55 + 1;
                      } while (lVar55 != 0x40);
                      (*psVar46->idct_block_kernel)
                                (paVar1[lVar56].data +
                                 uVar73 * 8 + (long)(iVar70 * 8 * paVar1[lVar56].w2),
                                 paVar1[lVar56].w2,psVar67);
                      uVar73 = uVar73 + 1;
                    } while (uVar73 != uVar75);
                  }
                  iVar70 = iVar70 + 1;
                } while (iVar70 != iVar42);
                psVar77 = psVar46->s;
              }
              lVar56 = lVar56 + 1;
              uVar75 = psVar77->img_n;
            } while (lVar56 < (int)uVar75);
LAB_0012393b:
            uVar69 = (2 < (int)uVar75) + 1 + (uint)(2 < (int)uVar75);
            if (req_comp != 0) {
              uVar69 = req_comp;
            }
            uVar44 = uVar75;
            if (uVar75 == 3) {
              bVar78 = true;
              uVar75 = 3;
              if (psVar46->rgb != 3) {
                uVar44 = 3;
                if (psVar46->app14_color_transform != 0) goto LAB_00123976;
                bVar78 = psVar46->jfif == 0;
              }
            }
            else {
LAB_00123976:
              uVar75 = uVar44;
              bVar78 = false;
            }
          }
          uVar44 = 1;
          if (bVar78) {
            uVar44 = uVar75;
          }
          if (uVar75 != 3) {
            uVar44 = uVar75;
          }
          if (2 < (int)uVar69) {
            uVar44 = uVar75;
          }
          local_88d8 = (undefined1  [16])0x0;
          _local_88e8 = (undefined1  [16])0x0;
          sVar43 = psVar77->img_x;
          if ((int)uVar44 < 1) {
LAB_001249aa:
            sVar65 = psVar77->img_y;
            psVar52 = (stbi__context *)stbi__malloc_mad3(uVar69,sVar43,sVar65,1);
            iVar42 = (int)extraout_RDX_03;
            if (psVar52 != (stbi__context *)0x0) {
              if (sVar65 != 0) {
                iVar70 = 0;
                uVar75 = 0;
                psVar60 = extraout_RDX_03;
                do {
                  sVar43 = psVar77->img_x;
                  if (0 < (int)uVar44) {
                    pasVar76 = (stbi_uc (*) [4])&local_88a8.ratio;
                    uVar73 = 0;
                    piVar72 = &psVar46->img_comp[0].y;
                    do {
                      asVar5 = pasVar76[-1];
                      asVar6 = pasVar76[-3];
                      iVar42 = (int)asVar6 >> 1;
                      auVar117 = (**(code **)(pasVar76 + -10))
                                           (*(stbi_uc **)(piVar72 + 10),
                                            *(undefined8 *)
                                             (*pasVar76 +
                                             ((ulong)(iVar42 <= (int)asVar5) << 3 |
                                             0xffffffffffffffe0)),
                                            *(undefined8 *)
                                             (*pasVar76 +
                                             ((ulong)((int)asVar5 < iVar42) << 3 |
                                             0xffffffffffffffe0)),pasVar76[-2],pasVar76[-4]);
                      psVar60 = auVar117._8_8_;
                      *(long *)(local_88e8 + uVar73 * 8) = auVar117._0_8_;
                      pasVar76[-1] = (stbi_uc  [4])((int)asVar5 + 1);
                      if ((int)asVar6 <= (int)asVar5 + 1) {
                        pasVar76[-1] = (stbi_uc  [4])0x0;
                        *(stbi_uc **)(pasVar76 + -8) = *(stbi_uc **)(pasVar76 + -6);
                        asVar5 = *pasVar76;
                        *pasVar76 = (stbi_uc  [4])((int)asVar5 + 1);
                        if ((int)asVar5 + 1 < *piVar72) {
                          *(stbi_uc **)(pasVar76 + -6) = *(stbi_uc **)(pasVar76 + -6) + piVar72[1];
                        }
                      }
                      uVar73 = uVar73 + 1;
                      piVar72 = piVar72 + 0x18;
                      pasVar76 = pasVar76 + 0xc;
                    } while (uVar44 != uVar73);
                  }
                  if ((int)uVar69 < 3) {
                    psVar77 = psVar46->s;
                    if (bVar78) {
                      if (uVar69 == 1) {
                        if (psVar77->img_x != 0) {
                          uVar73 = 0;
                          do {
                            bVar41 = *(byte *)(local_88d8._0_8_ + uVar73);
                            psVar52->buffer_start[uVar73 + sVar43 * iVar70 + -0x38] =
                                 (stbi_uc)((uint)bVar41 * 2 + ((uint)bVar41 + (uint)bVar41 * 8) * 3
                                           + (uint)stack0xffffffffffff7720[uVar73] * 0x96 +
                                             (uint)*(byte *)(local_88e8._0_8_ + uVar73) * 0x4d >> 8)
                            ;
                            uVar73 = uVar73 + 1;
                            psVar60 = (stbi_uc *)local_88d8._0_8_;
                          } while (uVar73 < psVar77->img_x);
                        }
                      }
                      else if (psVar77->img_x != 0) {
                        uVar73 = 0;
                        do {
                          bVar41 = *(byte *)(local_88d8._0_8_ + uVar73);
                          psVar52->buffer_start[uVar73 * 2 + (ulong)(sVar43 * iVar70) + -0x38] =
                               (stbi_uc)((uint)bVar41 * 2 + ((uint)bVar41 + (uint)bVar41 * 8) * 3 +
                                         (uint)stack0xffffffffffff7720[uVar73] * 0x96 +
                                         (uint)*(byte *)(local_88e8._0_8_ + uVar73) * 0x4d >> 8);
                          psVar52->buffer_start[uVar73 * 2 + (ulong)(sVar43 * iVar70) + -0x37] =
                               0xff;
                          uVar73 = uVar73 + 1;
                          psVar60 = (stbi_uc *)local_88d8._0_8_;
                        } while (uVar73 < psVar77->img_x);
                      }
                    }
                    else if (psVar77->img_n == 4) {
                      if (psVar46->app14_color_transform == 2) {
                        if (psVar77->img_x != 0) {
                          psVar63 = psVar52->buffer_start + ((ulong)(sVar43 * iVar70) - 0x37);
                          psVar60 = (stbi_uc *)0x0;
                          do {
                            iVar42 = (*(byte *)(local_88e8._0_8_ + (long)psVar60) ^ 0xff) *
                                     (uint)psVar60[local_88d8._8_8_];
                            psVar63[-1] = (char)((iVar42 + 0x80U >> 8) + iVar42 + 0x80 >> 8);
                            *psVar63 = 0xff;
                            psVar60 = psVar60 + 1;
                            psVar63 = psVar63 + uVar69;
                          } while (psVar60 < (stbi_uc *)(ulong)psVar77->img_x);
                        }
                      }
                      else {
                        if (psVar46->app14_color_transform != 0) goto LAB_00124e0a;
                        if (psVar77->img_x != 0) {
                          psVar63 = psVar52->buffer_start + ((ulong)(sVar43 * iVar70) - 0x37);
                          uVar73 = 0;
                          do {
                            bVar41 = *(byte *)(local_88d8._8_8_ + uVar73);
                            iVar42 = (uint)*(byte *)(local_88e8._0_8_ + uVar73) * (uint)bVar41;
                            iVar68 = (uint)stack0xffffffffffff7720[uVar73] * (uint)bVar41;
                            psVar63[-1] = (char)((((uint)*(byte *)(local_88d8._0_8_ + uVar73) *
                                                   (uint)bVar41 + 0x80 >> 8) +
                                                  (uint)*(byte *)(local_88d8._0_8_ + uVar73) *
                                                  (uint)bVar41 + 0x80 >> 8) * 0x1d +
                                                 (iVar68 + (iVar68 + 0x80U >> 8) + 0x80 >> 8) * 0x96
                                                 + (iVar42 + (iVar42 + 0x80U >> 8) + 0x80 >> 8) *
                                                   0x4d >> 8);
                            *psVar63 = 0xff;
                            uVar73 = uVar73 + 1;
                            psVar63 = psVar63 + uVar69;
                            psVar60 = stack0xffffffffffff7720;
                          } while (uVar73 < psVar77->img_x);
                        }
                      }
                    }
                    else {
LAB_00124e0a:
                      if (uVar69 == 1) {
                        if (psVar77->img_x != 0) {
                          psVar63 = (stbi_uc *)0x0;
                          do {
                            (psVar52->buffer_start + ((ulong)(sVar43 * iVar70) - 0x38))
                            [(long)psVar63] = *(stbi_uc *)(local_88e8._0_8_ + (long)psVar63);
                            psVar63 = psVar63 + 1;
                            psVar60 = (stbi_uc *)(ulong)psVar77->img_x;
                          } while (psVar63 < (stbi_uc *)(ulong)psVar77->img_x);
                        }
                      }
                      else if (psVar77->img_x != 0) {
                        psVar63 = (stbi_uc *)0x0;
                        do {
                          psVar52->buffer_start
                          [(long)psVar63 * 2 + (ulong)(sVar43 * iVar70) + -0x38] =
                               *(stbi_uc *)(local_88e8._0_8_ + (long)psVar63);
                          psVar52->buffer_start
                          [(long)psVar63 * 2 + (ulong)(sVar43 * iVar70) + -0x37] = 0xff;
                          psVar63 = psVar63 + 1;
                          psVar60 = (stbi_uc *)(ulong)psVar77->img_x;
                        } while (psVar63 < (stbi_uc *)(ulong)psVar77->img_x);
                      }
                    }
                  }
                  else {
                    psVar77 = psVar46->s;
                    if (psVar77->img_n == 3) {
                      if (bVar78) {
                        if (psVar77->img_x != 0) {
                          psVar63 = psVar52->buffer_start + ((ulong)(sVar43 * iVar70) - 0x35);
                          psVar60 = (stbi_uc *)0x0;
                          do {
                            psVar63[-3] = *(stbi_uc *)(local_88e8._0_8_ + (long)psVar60);
                            psVar63[-2] = stack0xffffffffffff7720[(long)psVar60];
                            psVar63[-1] = *(stbi_uc *)(local_88d8._0_8_ + (long)psVar60);
                            *psVar63 = 0xff;
                            psVar60 = psVar60 + 1;
                            psVar63 = psVar63 + uVar69;
                          } while (psVar60 < (stbi_uc *)(ulong)psVar77->img_x);
                        }
                      }
                      else {
LAB_00124e7d:
                        (*psVar46->YCbCr_to_RGB_kernel)
                                  (psVar52->buffer_start +
                                   ((ulong)(uVar75 * uVar69 * sVar43) - 0x38),
                                   (stbi_uc *)local_88e8._0_8_,stack0xffffffffffff7720,
                                   (stbi_uc *)local_88d8._0_8_,psVar77->img_x,uVar69);
                        psVar77 = psVar46->s;
                        psVar60 = extraout_RDX_04;
                      }
                    }
                    else if (psVar77->img_n == 4) {
                      if (psVar46->app14_color_transform == 2) {
                        (*psVar46->YCbCr_to_RGB_kernel)
                                  (psVar52->buffer_start +
                                   ((ulong)(uVar75 * uVar69 * sVar43) - 0x38),
                                   (stbi_uc *)local_88e8._0_8_,stack0xffffffffffff7720,
                                   (stbi_uc *)local_88d8._0_8_,psVar77->img_x,uVar69);
                        psVar77 = psVar46->s;
                        psVar60 = extraout_RDX_05;
                        if (psVar77->img_x != 0) {
                          psVar63 = psVar52->buffer_start + ((ulong)(sVar43 * iVar70) - 0x36);
                          uVar73 = 0;
                          do {
                            bVar41 = *(byte *)(local_88d8._8_8_ + uVar73);
                            iVar42 = (psVar63[-2] ^ 0xff) * (uint)bVar41;
                            psVar63[-2] = (byte)((iVar42 + 0x80U >> 8) + iVar42 + 0x80 >> 8);
                            iVar42 = (psVar63[-1] ^ 0xff) * (uint)bVar41;
                            psVar63[-1] = (byte)(iVar42 + (iVar42 + 0x80U >> 8) + 0x80 >> 8);
                            iVar42 = (*psVar63 ^ 0xff) * (uint)bVar41;
                            uVar58 = iVar42 + 0x80U >> 8;
                            *psVar63 = (byte)(iVar42 + uVar58 + 0x80 >> 8);
                            uVar73 = uVar73 + 1;
                            psVar63 = psVar63 + uVar69;
                            psVar60 = (stbi_uc *)(ulong)uVar58;
                          } while (uVar73 < psVar77->img_x);
                        }
                      }
                      else {
                        if (psVar46->app14_color_transform != 0) goto LAB_00124e7d;
                        if (psVar77->img_x != 0) {
                          psVar63 = psVar52->buffer_start + ((ulong)(sVar43 * iVar70) - 0x35);
                          uVar73 = 0;
                          do {
                            bVar41 = *(byte *)(local_88d8._8_8_ + uVar73);
                            iVar42 = (uint)*(byte *)(local_88e8._0_8_ + uVar73) * (uint)bVar41;
                            psVar63[-3] = (char)((iVar42 + 0x80U >> 8) + iVar42 + 0x80 >> 8);
                            iVar42 = (uint)stack0xffffffffffff7720[uVar73] * (uint)bVar41;
                            psVar63[-2] = (char)(iVar42 + (iVar42 + 0x80U >> 8) + 0x80 >> 8);
                            psVar63[-1] = (char)((uint)*(byte *)(local_88d8._0_8_ + uVar73) *
                                                 (uint)bVar41 +
                                                 ((uint)*(byte *)(local_88d8._0_8_ + uVar73) *
                                                  (uint)bVar41 + 0x80 >> 8) + 0x80 >> 8);
                            *psVar63 = 0xff;
                            uVar73 = uVar73 + 1;
                            psVar63 = psVar63 + uVar69;
                            psVar60 = (stbi_uc *)local_88d8._0_8_;
                          } while (uVar73 < psVar77->img_x);
                        }
                      }
                    }
                    else if (psVar77->img_x != 0) {
                      psVar63 = psVar52->buffer_start + ((ulong)(sVar43 * iVar70) - 0x35);
                      uVar73 = 0;
                      do {
                        sVar40 = *(stbi_uc *)(local_88e8._0_8_ + uVar73);
                        psVar63[-1] = sVar40;
                        psVar63[-2] = sVar40;
                        psVar63[-3] = sVar40;
                        *psVar63 = 0xff;
                        uVar73 = uVar73 + 1;
                        psVar63 = psVar63 + uVar69;
                      } while (uVar73 < psVar77->img_x);
                    }
                  }
                  iVar42 = (int)psVar60;
                  uVar75 = uVar75 + 1;
                  iVar70 = iVar70 + uVar69;
                } while (uVar75 < psVar77->img_y);
                uVar75 = psVar77->img_n;
              }
              stbi__free_jpeg_components(psVar46,uVar75,iVar42);
              psVar77 = psVar46->s;
              *x = psVar77->img_x;
              *y = psVar77->img_y;
              if (comp != (int *)0x0) {
                *comp = (uint)(2 < psVar77->img_n) * 2 + 1;
              }
              goto LAB_00123aac;
            }
            stbi__free_jpeg_components(psVar46,uVar75,iVar42);
            stbi__g_failure_reason = "outofmem";
            goto LAB_00123aa6;
          }
          lVar56 = 0;
          while( true ) {
            pvVar50 = malloc((ulong)(sVar43 + 3));
            *(void **)((long)&psVar46->img_comp[0].linebuf + lVar56 * 2) = pvVar50;
            if (pvVar50 == (void *)0x0) break;
            uVar73 = (long)psVar46->img_h_max /
                     (long)*(int *)((long)&psVar46->img_comp[0].h + lVar56 * 2);
            iVar42 = (int)uVar73;
            *(int *)((long)(local_88a8.pal + -7) + lVar56) = iVar42;
            iVar70 = psVar46->img_v_max / *(int *)((long)&psVar46->img_comp[0].v + lVar56 * 2);
            *(int *)((long)(local_88a8.pal + -6) + lVar56) = iVar70;
            *(int *)((long)(local_88a8.pal + -4) + lVar56) = iVar70 >> 1;
            *(int *)((long)(local_88a8.pal + -5) + lVar56) =
                 (int)((ulong)((sVar43 - 1) + iVar42) / (uVar73 & 0xffffffff));
            *(undefined4 *)((long)(local_88a8.pal + -3) + lVar56) = 0;
            uVar7 = *(undefined8 *)((long)&psVar46->img_comp[0].data + lVar56 * 2);
            *(undefined8 *)((long)(local_88a8.pal + -9) + lVar56) = uVar7;
            *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar56) = uVar7;
            if (iVar42 == 2) {
              pcVar51 = stbi__resample_row_h_2;
              if (iVar70 != 1) {
                if (iVar70 != 2) goto LAB_0012498e;
                pcVar51 = psVar46->resample_row_hv_2_kernel;
              }
            }
            else if (iVar42 == 1) {
              pcVar51 = stbi__resample_row_generic;
              if (iVar70 == 2) {
                pcVar51 = stbi__resample_row_v_2;
              }
              if (iVar70 == 1) {
                pcVar51 = resample_row_1;
              }
            }
            else {
LAB_0012498e:
              pcVar51 = stbi__resample_row_generic;
            }
            *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar56) = pcVar51;
            lVar56 = lVar56 + 0x30;
            if ((ulong)uVar44 * 0x30 == lVar56) goto LAB_001249aa;
          }
          stbi__free_jpeg_components(psVar46,uVar75,why);
          stbi__g_failure_reason = "outofmem";
          psVar52 = (stbi__context *)0x0;
          goto LAB_00123aac;
        }
        iVar42 = stbi__process_marker(psVar46,uVar75);
        uVar75 = extraout_EDX_00;
        if (iVar42 != 0) goto LAB_00121e50;
      }
LAB_00123a92:
      stbi__free_jpeg_components(psVar46,psVar46->s->img_n,uVar75);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_00123aa6:
    psVar52 = (stbi__context *)0x0;
LAB_00123aac:
    free(psVar46);
  }
  else {
    iVar42 = stbi__check_png_header(s);
    psVar54 = s->img_buffer_original;
    psVar63 = s->img_buffer_original_end;
    s->img_buffer = psVar54;
    s->img_buffer_end = psVar63;
    if (iVar42 != 0) {
      if ((uint)req_comp < 5) {
        local_88a8._0_8_ = s;
        iVar42 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
        uVar7 = local_88a8._0_8_;
        if (iVar42 == 0) {
          psVar52 = (stbi__context *)0x0;
        }
        else {
          iVar42 = 8;
          if (8 < local_88a8.flags) {
            iVar42 = local_88a8.flags;
          }
          ri->bits_per_channel = iVar42;
          psVar52 = (stbi__context *)local_88a8.history;
          if ((req_comp != 0) && (iVar42 = *(int *)(local_88a8._0_8_ + 0xc), iVar42 != req_comp)) {
            if (local_88a8.flags < 9) {
              psVar52 = (stbi__context *)
                        stbi__convert_format
                                  (local_88a8.history,iVar42,req_comp,
                                   *(stbi__uint32 *)local_88a8._0_8_,
                                   *(stbi__uint32 *)(local_88a8._0_8_ + 4));
            }
            else {
              psVar52 = (stbi__context *)
                        stbi__convert_format16
                                  ((stbi__uint16 *)local_88a8.history,iVar42,req_comp,
                                   *(stbi__uint32 *)local_88a8._0_8_,
                                   *(stbi__uint32 *)(local_88a8._0_8_ + 4));
            }
            *(int *)(uVar7 + 0xc) = req_comp;
            if (psVar52 == (stbi__context *)0x0) goto LAB_00121d5b;
          }
          *x = *(stbi__uint32 *)uVar7;
          *y = *(stbi__uint32 *)(uVar7 + 4);
          if (comp != (int *)0x0) {
            *comp = *(int *)(uVar7 + 8);
          }
          local_88a8.history = (stbi_uc *)0x0;
        }
        free(local_88a8.history);
        free(local_88a8.background);
        psVar46 = (stbi__jpeg *)local_88a8.out;
        goto LAB_00123aac;
      }
      stbi__g_failure_reason = "bad req_comp";
      goto LAB_00121d5b;
    }
    if (psVar54 < psVar63) {
      psVar49 = psVar54 + 1;
      s->img_buffer = psVar49;
      sVar40 = *psVar54;
LAB_00123392:
      if (sVar40 != 'B') goto LAB_00123576;
      if (psVar49 < psVar63) {
        s->img_buffer = psVar49 + 1;
        sVar40 = *psVar49;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_00123576;
        psVar63 = s->buffer_start;
        iVar42 = (*(s->io).read)(s->io_user_data,(char *)psVar63,s->buflen);
        if (iVar42 == 0) {
          s->read_from_callbacks = 0;
          psVar54 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar40 = '\0';
        }
        else {
          psVar54 = psVar63 + iVar42;
          sVar40 = *psVar63;
        }
        s->img_buffer_end = psVar54;
        s->img_buffer = s->buffer_start + 1;
      }
      if (sVar40 != 'M') goto LAB_00123576;
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      uVar75 = stbi__get16le(s);
      iVar42 = stbi__get16le(s);
      uVar75 = iVar42 << 0x10 | uVar75;
      if (((0x38 < uVar75) || ((0x100010000001000U >> ((ulong)uVar75 & 0x3f) & 1) == 0)) &&
         (uVar75 != 0x6c)) {
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        if (uVar75 == 0x7c) goto LAB_001234e1;
        goto LAB_00123586;
      }
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
LAB_001234e1:
      local_88d8._12_4_ = 0xff;
      pvVar50 = stbi__bmp_parse_header(s,(stbi__bmp_data *)local_88e8);
      if (pvVar50 == (void *)0x0) goto LAB_00121d5b;
      local_88b0 = s->img_y;
      sVar43 = -local_88b0;
      if (0 < (int)local_88b0) {
        sVar43 = local_88b0;
      }
      s->img_y = sVar43;
      z_01 = local_88d8._8_4_;
      uVar38 = local_88e8._0_4_;
      uVar39 = local_88e8._8_4_;
      if (local_88e8._8_4_ == 0xc) {
        if ((int)local_88e8._0_4_ < 0x18) {
          local_8970 = (ulong)(uint)((local_88e8._4_4_ + -0x26) / 3);
        }
        else {
LAB_001236f2:
          local_8970 = 0;
        }
      }
      else {
        if (0xf < (int)local_88e8._0_4_) goto LAB_001236f2;
        local_8970 = (ulong)(uint)((local_88e8._4_4_ - local_88e8._8_4_) + -0xe >> 2);
      }
      uVar75 = uStack_88dc;
      z = local_88d8._0_4_;
      z_00 = local_88d8._4_4_;
      uVar69 = local_88d8._12_4_;
      iVar42 = 4 - (uint)(local_88d8._8_4_ == 0);
      s->img_n = iVar42;
      if (2 < req_comp) {
        iVar42 = req_comp;
      }
      sVar65 = s->img_x;
      iVar70 = stbi__mad3sizes_valid(iVar42,sVar65,sVar43,0);
      if (iVar70 == 0) {
        stbi__g_failure_reason = "too large";
      }
      else {
        data_00 = (uchar *)stbi__malloc_mad3(iVar42,sVar65,sVar43,0);
        if (data_00 == (uchar *)0x0) {
          stbi__g_failure_reason = "outofmem";
        }
        else {
          if ((int)uVar38 < 0x10) {
            iVar70 = (int)local_8970;
            if (0x100 < iVar70 || iVar70 == 0) {
              free(data_00);
              stbi__g_failure_reason = "invalid";
              goto LAB_00121d5b;
            }
            if (0 < iVar70) {
              psVar60 = s->buffer_start;
              psVar63 = s->buffer_start + 1;
              psVar54 = s->img_buffer;
              psVar49 = s->img_buffer_end;
              uVar73 = 0;
              do {
                if (psVar54 < psVar49) {
                  s->img_buffer = psVar54 + 1;
                  sVar40 = *psVar54;
                  psVar54 = psVar54 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar40 = '\0';
                }
                else {
                  iVar68 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                  if (iVar68 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar40 = '\0';
                    psVar49 = psVar63;
                  }
                  else {
                    sVar40 = *psVar60;
                    psVar49 = psVar60 + iVar68;
                  }
                  s->img_buffer_end = psVar49;
                  s->img_buffer = psVar63;
                  psVar54 = psVar63;
                }
                local_88a8.pal[uVar73 - 0xd][2] = sVar40;
                if (psVar54 < psVar49) {
                  s->img_buffer = psVar54 + 1;
                  sVar40 = *psVar54;
                  psVar54 = psVar54 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar40 = '\0';
                }
                else {
                  iVar68 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                  if (iVar68 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar40 = '\0';
                    psVar49 = psVar63;
                  }
                  else {
                    sVar40 = *psVar60;
                    psVar49 = psVar60 + iVar68;
                  }
                  s->img_buffer_end = psVar49;
                  s->img_buffer = psVar63;
                  psVar54 = psVar63;
                }
                local_88a8.pal[uVar73 - 0xd][1] = sVar40;
                if (psVar54 < psVar49) {
                  s->img_buffer = psVar54 + 1;
                  sVar40 = *psVar54;
                  psVar54 = psVar54 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar40 = '\0';
                }
                else {
                  iVar68 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                  if (iVar68 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar40 = '\0';
                    psVar49 = psVar63;
                  }
                  else {
                    sVar40 = *psVar60;
                    psVar49 = psVar60 + iVar68;
                  }
                  s->img_buffer_end = psVar49;
                  s->img_buffer = psVar63;
                  psVar54 = psVar63;
                }
                local_88a8.pal[uVar73 - 0xd][0] = sVar40;
                if (uVar39 != 0xc) {
                  if (psVar54 < psVar49) {
                    psVar54 = psVar54 + 1;
                  }
                  else {
                    if (s->read_from_callbacks == 0) goto LAB_00123c7e;
                    iVar68 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                    if (iVar68 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      psVar49 = psVar63;
                    }
                    else {
                      psVar49 = psVar60 + iVar68;
                    }
                    s->img_buffer_end = psVar49;
                    psVar54 = psVar63;
                  }
                  s->img_buffer = psVar54;
                }
LAB_00123c7e:
                local_88a8.pal[uVar73 - 0xd][3] = 0xff;
                uVar73 = uVar73 + 1;
              } while (local_8970 != uVar73);
            }
            stbi__skip(s,(iVar70 * (uVar39 == 0xc | 0xfffffffc) - uVar39) + local_88e8._4_4_ + -0xe)
            ;
            if (uVar38 == 1) {
              sVar43 = s->img_y;
              if (0 < (int)sVar43) {
                sVar65 = s->img_x;
                psVar60 = s->buffer_start;
                psVar63 = s->buffer_start + 1;
                iVar68 = 0;
                iVar70 = 0;
                do {
                  psVar54 = s->img_buffer;
                  psVar49 = s->img_buffer_end;
                  if (psVar54 < psVar49) {
                    s->img_buffer = psVar54 + 1;
                    bVar41 = *psVar54;
                    psVar54 = psVar54 + 1;
                  }
                  else if (s->read_from_callbacks == 0) {
                    bVar41 = 0;
                  }
                  else {
                    iVar57 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                    if (iVar57 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      bVar41 = 0;
                      psVar49 = psVar63;
                    }
                    else {
                      bVar41 = *psVar60;
                      psVar49 = psVar60 + iVar57;
                    }
                    s->img_buffer_end = psVar49;
                    s->img_buffer = psVar63;
                    psVar54 = psVar63;
                  }
                  sVar43 = s->img_x;
                  if (0 < (int)sVar43) {
                    uVar75 = (uint)bVar41;
                    sVar61 = 0;
                    uVar44 = 7;
                    do {
                      uVar73 = (ulong)((uVar75 >> (uVar44 & 0x1f) & 1) != 0);
                      data_00[iVar68] = local_88a8.pal[uVar73 - 0xd][0];
                      data_00[(long)iVar68 + 1] = local_88a8.pal[uVar73 - 0xd][1];
                      data_00[(long)iVar68 + 2] = local_88a8.pal[uVar73 - 0xd][2];
                      iVar57 = iVar68 + 3;
                      if (iVar42 == 4) {
                        data_00[(long)iVar68 + 3] = 0xff;
                        iVar57 = iVar68 + 4;
                      }
                      iVar68 = iVar57;
                      sVar61 = sVar61 + 1;
                      if (sVar61 == sVar43) break;
                      if ((int)uVar44 < 1) {
                        if (psVar54 < psVar49) {
                          s->img_buffer = psVar54 + 1;
                          uVar75 = (uint)*psVar54;
                          psVar54 = psVar54 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          uVar75 = 0;
                        }
                        else {
                          iVar57 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                          if (iVar57 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            uVar75 = 0;
                            psVar49 = psVar63;
                          }
                          else {
                            uVar75 = (uint)*psVar60;
                            psVar49 = psVar60 + iVar57;
                          }
                          s->img_buffer_end = psVar49;
                          s->img_buffer = psVar63;
                          sVar43 = s->img_x;
                          psVar54 = psVar63;
                        }
                        uVar44 = 7;
                      }
                      else {
                        uVar44 = uVar44 - 1;
                      }
                    } while ((int)sVar61 < (int)sVar43);
                  }
                  stbi__skip(s,-(sVar65 + 7 >> 3) & 3);
                  iVar70 = iVar70 + 1;
                  sVar43 = s->img_y;
                } while (iVar70 < (int)sVar43);
              }
            }
            else {
              if (uVar38 == 8) {
                uVar75 = s->img_x;
              }
              else {
                if (uVar38 != 4) {
                  free(data_00);
                  stbi__g_failure_reason = "bad bpp";
                  goto LAB_00121d5b;
                }
                uVar75 = s->img_x + 1 >> 1;
              }
              sVar43 = s->img_y;
              if (0 < (int)sVar43) {
                local_8920 = -uVar75 & 3;
                psVar60 = s->buffer_start;
                psVar63 = s->buffer_start + 1;
                uVar73 = 0;
                iVar70 = 0;
                do {
                  if (0 < (int)s->img_x) {
                    psVar54 = s->img_buffer;
                    psVar49 = s->img_buffer_end;
                    iVar68 = 0;
                    do {
                      if (psVar54 < psVar49) {
                        s->img_buffer = psVar54 + 1;
                        bVar41 = *psVar54;
                        psVar54 = psVar54 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar41 = 0;
                      }
                      else {
                        iVar57 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                        if (iVar57 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar41 = 0;
                          psVar49 = psVar63;
                        }
                        else {
                          bVar41 = *psVar60;
                          psVar49 = psVar60 + iVar57;
                        }
                        s->img_buffer_end = psVar49;
                        s->img_buffer = psVar63;
                        psVar54 = psVar63;
                      }
                      uVar75 = (uint)(bVar41 >> 4);
                      if (uVar38 != 4) {
                        uVar75 = (uint)bVar41;
                      }
                      uVar66 = (ulong)uVar75;
                      uVar75 = bVar41 & 0xf;
                      if (uVar38 != 4) {
                        uVar75 = 0;
                      }
                      lVar56 = (long)(int)uVar73;
                      uVar71 = lVar56 + 3;
                      data_00[lVar56] = local_88a8.pal[uVar66 - 0xd][0];
                      data_00[lVar56 + 1] = local_88a8.pal[uVar66 - 0xd][1];
                      data_00[lVar56 + 2] = local_88a8.pal[uVar66 - 0xd][2];
                      if (iVar42 == 4) {
                        data_00[lVar56 + 3] = 0xff;
                        uVar71 = (ulong)((int)uVar73 + 4);
                      }
                      if (iVar68 + 1U == s->img_x) {
                        uVar73 = uVar71 & 0xffffffff;
                        break;
                      }
                      if (uVar38 == 8) {
                        if (psVar54 < psVar49) {
                          s->img_buffer = psVar54 + 1;
                          bVar41 = *psVar54;
                          psVar54 = psVar54 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          bVar41 = 0;
                        }
                        else {
                          iVar57 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                          if (iVar57 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar41 = 0;
                            psVar49 = psVar63;
                          }
                          else {
                            bVar41 = *psVar60;
                            psVar49 = psVar60 + iVar57;
                          }
                          s->img_buffer_end = psVar49;
                          s->img_buffer = psVar63;
                          psVar54 = psVar63;
                        }
                        uVar75 = (uint)bVar41;
                      }
                      lVar56 = (long)(int)uVar71;
                      uVar73 = lVar56 + 3;
                      uVar66 = (ulong)uVar75;
                      data_00[lVar56] = local_88a8.pal[uVar66 - 0xd][0];
                      data_00[lVar56 + 1] = local_88a8.pal[uVar66 - 0xd][1];
                      data_00[lVar56 + 2] = local_88a8.pal[uVar66 - 0xd][2];
                      if (iVar42 == 4) {
                        data_00[lVar56 + 3] = 0xff;
                        uVar73 = (ulong)((int)uVar71 + 4);
                      }
                      iVar68 = iVar68 + 2;
                    } while (iVar68 < (int)s->img_x);
                  }
                  stbi__skip(s,local_8920);
                  iVar70 = iVar70 + 1;
                  sVar43 = s->img_y;
                } while (iVar70 < (int)sVar43);
              }
            }
          }
          else {
            stbi__skip(s,(local_88e8._4_4_ - uVar39) + -0xe);
            if (uVar38 == 0x10) {
              local_88ec = s->img_x * 2 & 2;
LAB_00123df5:
              if (z_00 == 0 || (z == 0 || uVar75 == 0)) {
                free(data_00);
                stbi__g_failure_reason = "bad masks";
                goto LAB_00121d5b;
              }
              iVar70 = stbi__high_bit(uVar75);
              iVar70 = iVar70 + -7;
              uVar44 = (uVar75 >> 1 & 0x55555555) + (uVar75 & 0x55555555);
              uVar44 = (uVar44 >> 2 & 0x33333333) + (uVar44 & 0x33333333);
              uVar44 = (uVar44 >> 4) + uVar44 & 0xf0f0f0f;
              uVar44 = (uVar44 >> 8) + uVar44;
              uVar44 = (uVar44 >> 0x10) + uVar44 & 0xff;
              iVar68 = stbi__high_bit(z);
              local_88c8 = CONCAT44(local_88c8._4_4_,iVar68 + -7);
              uVar58 = ((uint)z >> 1 & 0x55555555) + (z & 0x55555555);
              uVar58 = (uVar58 >> 2 & 0x33333333) + (uVar58 & 0x33333333);
              uVar58 = (uVar58 >> 4) + uVar58 & 0xf0f0f0f;
              uVar58 = (uVar58 >> 8) + uVar58;
              local_8944 = (uVar58 >> 0x10) + uVar58 & 0xff;
              local_8934 = stbi__high_bit(z_00);
              local_8934 = local_8934 + -7;
              uVar58 = ((uint)z_00 >> 1 & 0x55555555) + (z_00 & 0x55555555);
              uVar58 = (uVar58 >> 2 & 0x33333333) + (uVar58 & 0x33333333);
              uVar58 = (uVar58 >> 4) + uVar58 & 0xf0f0f0f;
              uVar58 = (uVar58 >> 8) + uVar58;
              local_88b8 = (anon_struct_96_18_0d0905d3 *)
                           (CONCAT44(local_88b8._4_4_,(uVar58 >> 0x10) + uVar58) &
                           0xffffffff000000ff);
              local_8904 = stbi__high_bit(z_01);
              local_8904 = local_8904 + -7;
              uVar58 = ((uint)z_01 >> 1 & 0x55555555) + (z_01 & 0x55555555);
              uVar58 = (uVar58 >> 2 & 0x33333333) + (uVar58 & 0x33333333);
              uVar58 = (uVar58 >> 4) + uVar58 & 0xf0f0f0f;
              uVar58 = (uVar58 >> 8) + uVar58;
              local_88bc = (uVar58 >> 0x10) + uVar58 & 0xff;
              local_88c0 = 1;
              bVar78 = false;
            }
            else {
              if (uVar38 == 0x20) {
                local_88ec = 0;
                if (z_01 != 0xff000000 || (uVar75 != 0xff0000 || (z != 0xff00 || z_00 != 0xff)))
                goto LAB_00123df5;
                bVar78 = true;
              }
              else {
                local_88ec = 0;
                if (uVar38 != 0x18) goto LAB_00123df5;
                local_88ec = s->img_x & 3;
                bVar78 = false;
              }
              local_88c0 = 0;
              iVar70 = 0;
              local_88c8 = local_88c8 & 0xffffffff00000000;
              local_8934 = 0;
              local_8904 = 0;
              uVar44 = 0;
              local_8944 = 0;
              local_88b8 = (anon_struct_96_18_0d0905d3 *)((ulong)local_88b8 & 0xffffffff00000000);
              local_88bc = 0;
            }
            sVar43 = s->img_y;
            if (0 < (int)sVar43) {
              psVar60 = s->buffer_start;
              psVar63 = s->buffer_start + 1;
              iVar57 = 0;
              iVar68 = 0;
              do {
                local_88ac = iVar68;
                if ((char)local_88c0 == '\0') {
                  if (0 < (int)s->img_x) {
                    psVar54 = s->img_buffer;
                    psVar49 = s->img_buffer_end;
                    iVar68 = 0;
                    do {
                      if (psVar54 < psVar49) {
                        s->img_buffer = psVar54 + 1;
                        bVar41 = *psVar54;
                        psVar54 = psVar54 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar41 = 0;
                      }
                      else {
                        iVar64 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                        if (iVar64 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar41 = 0;
                          psVar49 = psVar63;
                        }
                        else {
                          bVar41 = *psVar60;
                          psVar49 = psVar60 + iVar64;
                        }
                        s->img_buffer_end = psVar49;
                        s->img_buffer = psVar63;
                        psVar54 = psVar63;
                      }
                      data_00[(long)iVar57 + 2] = bVar41;
                      if (psVar54 < psVar49) {
                        s->img_buffer = psVar54 + 1;
                        bVar41 = *psVar54;
                        psVar54 = psVar54 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar41 = 0;
                      }
                      else {
                        iVar64 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                        if (iVar64 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar41 = 0;
                          psVar49 = psVar63;
                        }
                        else {
                          bVar41 = *psVar60;
                          psVar49 = psVar60 + iVar64;
                        }
                        s->img_buffer_end = psVar49;
                        s->img_buffer = psVar63;
                        psVar54 = psVar63;
                      }
                      data_00[(long)iVar57 + 1] = bVar41;
                      if (psVar54 < psVar49) {
                        s->img_buffer = psVar54 + 1;
                        bVar41 = *psVar54;
                        psVar54 = psVar54 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar41 = 0;
                      }
                      else {
                        iVar64 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                        if (iVar64 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar41 = 0;
                          psVar49 = psVar63;
                        }
                        else {
                          bVar41 = *psVar60;
                          psVar49 = psVar60 + iVar64;
                        }
                        s->img_buffer_end = psVar49;
                        s->img_buffer = psVar63;
                        psVar54 = psVar63;
                      }
                      data_00[iVar57] = bVar41;
                      bVar41 = 0xff;
                      if (bVar78) {
                        if (psVar54 < psVar49) {
                          s->img_buffer = psVar54 + 1;
                          bVar41 = *psVar54;
                          psVar54 = psVar54 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          bVar41 = 0;
                        }
                        else {
                          iVar64 = (*(s->io).read)(s->io_user_data,(char *)psVar60,s->buflen);
                          if (iVar64 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar41 = 0;
                            psVar49 = psVar63;
                          }
                          else {
                            bVar41 = *psVar60;
                            psVar49 = psVar60 + iVar64;
                          }
                          s->img_buffer_end = psVar49;
                          s->img_buffer = psVar63;
                          psVar54 = psVar63;
                        }
                      }
                      iVar64 = iVar57 + 3;
                      if (iVar42 == 4) {
                        data_00[(long)iVar57 + 3] = bVar41;
                        iVar64 = iVar57 + 4;
                      }
                      iVar57 = iVar64;
                      uVar69 = uVar69 | bVar41;
                      iVar68 = iVar68 + 1;
                    } while (iVar68 < (int)s->img_x);
                  }
                }
                else if (0 < (int)s->img_x) {
                  iVar68 = 0;
                  do {
                    uVar58 = stbi__get16le(s);
                    if (uVar38 != 0x10) {
                      iVar64 = stbi__get16le(s);
                      uVar58 = uVar58 | iVar64 << 0x10;
                    }
                    iVar64 = stbi__shiftsigned(uVar58 & uVar75,iVar70,uVar44);
                    data_00[iVar57] = (uchar)iVar64;
                    iVar64 = stbi__shiftsigned(uVar58 & z,(int)local_88c8,local_8944);
                    data_00[(long)iVar57 + 1] = (uchar)iVar64;
                    iVar64 = stbi__shiftsigned(uVar58 & z_00,local_8934,(int)local_88b8);
                    data_00[(long)iVar57 + 2] = (uchar)iVar64;
                    if (z_01 == 0) {
                      uVar58 = 0xff;
                    }
                    else {
                      uVar58 = stbi__shiftsigned(uVar58 & z_01,local_8904,local_88bc);
                    }
                    iVar64 = iVar57 + 3;
                    if (iVar42 == 4) {
                      data_00[(long)iVar57 + 3] = (uchar)uVar58;
                      iVar64 = iVar57 + 4;
                    }
                    iVar57 = iVar64;
                    uVar69 = uVar69 | uVar58;
                    iVar68 = iVar68 + 1;
                  } while (iVar68 < (int)s->img_x);
                }
                stbi__skip(s,local_88ec);
                iVar68 = local_88ac + 1;
                sVar43 = s->img_y;
              } while (iVar68 < (int)sVar43);
            }
          }
          auVar37 = _DAT_00152150;
          auVar36 = _DAT_00152140;
          auVar35 = _DAT_00152130;
          auVar34 = _DAT_00152120;
          auVar33 = _DAT_00152110;
          auVar32 = _DAT_00152100;
          auVar117 = _DAT_001520f0;
          if (((iVar42 == 4) && (uVar69 == 0)) &&
             (uVar75 = s->img_x * sVar43 * 4 - 1, -1 < (int)uVar75)) {
            uVar69 = uVar75 >> 2;
            auVar79._4_4_ = 0;
            auVar79._0_4_ = uVar69;
            auVar79._8_4_ = uVar69;
            auVar79._12_4_ = 0;
            puVar53 = data_00 + uVar75;
            uVar73 = 0;
            do {
              auVar97._8_4_ = (int)uVar73;
              auVar97._0_8_ = uVar73;
              auVar97._12_4_ = (int)(uVar73 >> 0x20);
              auVar99 = auVar79 | auVar37;
              auVar101 = (auVar97 | auVar36) ^ auVar37;
              iVar70 = auVar99._0_4_;
              iVar74 = -(uint)(iVar70 < auVar101._0_4_);
              iVar68 = auVar99._4_4_;
              auVar103._4_4_ = -(uint)(iVar68 < auVar101._4_4_);
              iVar57 = auVar99._8_4_;
              iVar45 = -(uint)(iVar57 < auVar101._8_4_);
              iVar64 = auVar99._12_4_;
              auVar103._12_4_ = -(uint)(iVar64 < auVar101._12_4_);
              auVar80._4_4_ = iVar74;
              auVar80._0_4_ = iVar74;
              auVar80._8_4_ = iVar45;
              auVar80._12_4_ = iVar45;
              auVar80 = pshuflw(in_XMM1,auVar80,0xe8);
              auVar102._4_4_ = -(uint)(auVar101._4_4_ == iVar68);
              auVar102._12_4_ = -(uint)(auVar101._12_4_ == iVar64);
              auVar102._0_4_ = auVar102._4_4_;
              auVar102._8_4_ = auVar102._12_4_;
              auVar89 = pshuflw(in_XMM2,auVar102,0xe8);
              auVar103._0_4_ = auVar103._4_4_;
              auVar103._8_4_ = auVar103._12_4_;
              auVar101 = pshuflw(auVar80,auVar103,0xe8);
              auVar99._8_4_ = 0xffffffff;
              auVar99._0_8_ = 0xffffffffffffffff;
              auVar99._12_4_ = 0xffffffff;
              auVar99 = (auVar101 | auVar89 & auVar80) ^ auVar99;
              auVar99 = packssdw(auVar99,auVar99);
              if ((auVar99 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *puVar53 = 0xff;
              }
              auVar89._4_4_ = iVar74;
              auVar89._0_4_ = iVar74;
              auVar89._8_4_ = iVar45;
              auVar89._12_4_ = iVar45;
              auVar103 = auVar102 & auVar89 | auVar103;
              auVar99 = packssdw(auVar103,auVar103);
              auVar101._8_4_ = 0xffffffff;
              auVar101._0_8_ = 0xffffffffffffffff;
              auVar101._12_4_ = 0xffffffff;
              auVar99 = packssdw(auVar99 ^ auVar101,auVar99 ^ auVar101);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99._0_4_ >> 8 & 1) != 0) {
                puVar53[-4] = 0xff;
              }
              auVar99 = (auVar97 | auVar35) ^ auVar37;
              auVar90._0_4_ = -(uint)(iVar70 < auVar99._0_4_);
              auVar90._4_4_ = -(uint)(iVar68 < auVar99._4_4_);
              auVar90._8_4_ = -(uint)(iVar57 < auVar99._8_4_);
              auVar90._12_4_ = -(uint)(iVar64 < auVar99._12_4_);
              auVar104._4_4_ = auVar90._0_4_;
              auVar104._0_4_ = auVar90._0_4_;
              auVar104._8_4_ = auVar90._8_4_;
              auVar104._12_4_ = auVar90._8_4_;
              iVar74 = -(uint)(auVar99._4_4_ == iVar68);
              iVar45 = -(uint)(auVar99._12_4_ == iVar64);
              auVar18._4_4_ = iVar74;
              auVar18._0_4_ = iVar74;
              auVar18._8_4_ = iVar45;
              auVar18._12_4_ = iVar45;
              auVar114._4_4_ = auVar90._4_4_;
              auVar114._0_4_ = auVar90._4_4_;
              auVar114._8_4_ = auVar90._12_4_;
              auVar114._12_4_ = auVar90._12_4_;
              auVar99 = auVar18 & auVar104 | auVar114;
              auVar99 = packssdw(auVar99,auVar99);
              auVar9._8_4_ = 0xffffffff;
              auVar9._0_8_ = 0xffffffffffffffff;
              auVar9._12_4_ = 0xffffffff;
              auVar99 = packssdw(auVar99 ^ auVar9,auVar99 ^ auVar9);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99._0_4_ >> 0x10 & 1) != 0) {
                puVar53[-8] = 0xff;
              }
              auVar99 = pshufhw(auVar99,auVar104,0x84);
              auVar19._4_4_ = iVar74;
              auVar19._0_4_ = iVar74;
              auVar19._8_4_ = iVar45;
              auVar19._12_4_ = iVar45;
              auVar101 = pshufhw(auVar90,auVar19,0x84);
              auVar80 = pshufhw(auVar99,auVar114,0x84);
              auVar81._8_4_ = 0xffffffff;
              auVar81._0_8_ = 0xffffffffffffffff;
              auVar81._12_4_ = 0xffffffff;
              auVar81 = (auVar80 | auVar101 & auVar99) ^ auVar81;
              auVar99 = packssdw(auVar81,auVar81);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99._0_4_ >> 0x18 & 1) != 0) {
                puVar53[-0xc] = 0xff;
              }
              auVar99 = (auVar97 | auVar34) ^ auVar37;
              auVar91._0_4_ = -(uint)(iVar70 < auVar99._0_4_);
              auVar91._4_4_ = -(uint)(iVar68 < auVar99._4_4_);
              auVar91._8_4_ = -(uint)(iVar57 < auVar99._8_4_);
              auVar91._12_4_ = -(uint)(iVar64 < auVar99._12_4_);
              auVar20._4_4_ = auVar91._0_4_;
              auVar20._0_4_ = auVar91._0_4_;
              auVar20._8_4_ = auVar91._8_4_;
              auVar20._12_4_ = auVar91._8_4_;
              auVar101 = pshuflw(auVar114,auVar20,0xe8);
              auVar82._0_4_ = -(uint)(auVar99._0_4_ == iVar70);
              auVar82._4_4_ = -(uint)(auVar99._4_4_ == iVar68);
              auVar82._8_4_ = -(uint)(auVar99._8_4_ == iVar57);
              auVar82._12_4_ = -(uint)(auVar99._12_4_ == iVar64);
              auVar105._4_4_ = auVar82._4_4_;
              auVar105._0_4_ = auVar82._4_4_;
              auVar105._8_4_ = auVar82._12_4_;
              auVar105._12_4_ = auVar82._12_4_;
              auVar99 = pshuflw(auVar82,auVar105,0xe8);
              auVar106._4_4_ = auVar91._4_4_;
              auVar106._0_4_ = auVar91._4_4_;
              auVar106._8_4_ = auVar91._12_4_;
              auVar106._12_4_ = auVar91._12_4_;
              auVar80 = pshuflw(auVar91,auVar106,0xe8);
              auVar10._8_4_ = 0xffffffff;
              auVar10._0_8_ = 0xffffffffffffffff;
              auVar10._12_4_ = 0xffffffff;
              auVar99 = packssdw(auVar99 & auVar101,(auVar80 | auVar99 & auVar101) ^ auVar10);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar53[-0x10] = 0xff;
              }
              auVar21._4_4_ = auVar91._0_4_;
              auVar21._0_4_ = auVar91._0_4_;
              auVar21._8_4_ = auVar91._8_4_;
              auVar21._12_4_ = auVar91._8_4_;
              auVar106 = auVar105 & auVar21 | auVar106;
              auVar80 = packssdw(auVar106,auVar106);
              auVar11._8_4_ = 0xffffffff;
              auVar11._0_8_ = 0xffffffffffffffff;
              auVar11._12_4_ = 0xffffffff;
              auVar99 = packssdw(auVar99,auVar80 ^ auVar11);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99._4_2_ >> 8 & 1) != 0) {
                puVar53[-0x14] = 0xff;
              }
              auVar99 = (auVar97 | auVar33) ^ auVar37;
              auVar92._0_4_ = -(uint)(iVar70 < auVar99._0_4_);
              auVar92._4_4_ = -(uint)(iVar68 < auVar99._4_4_);
              auVar92._8_4_ = -(uint)(iVar57 < auVar99._8_4_);
              auVar92._12_4_ = -(uint)(iVar64 < auVar99._12_4_);
              auVar107._4_4_ = auVar92._0_4_;
              auVar107._0_4_ = auVar92._0_4_;
              auVar107._8_4_ = auVar92._8_4_;
              auVar107._12_4_ = auVar92._8_4_;
              iVar74 = -(uint)(auVar99._4_4_ == iVar68);
              iVar45 = -(uint)(auVar99._12_4_ == iVar64);
              auVar22._4_4_ = iVar74;
              auVar22._0_4_ = iVar74;
              auVar22._8_4_ = iVar45;
              auVar22._12_4_ = iVar45;
              auVar115._4_4_ = auVar92._4_4_;
              auVar115._0_4_ = auVar92._4_4_;
              auVar115._8_4_ = auVar92._12_4_;
              auVar115._12_4_ = auVar92._12_4_;
              auVar99 = auVar22 & auVar107 | auVar115;
              auVar99 = packssdw(auVar99,auVar99);
              auVar12._8_4_ = 0xffffffff;
              auVar12._0_8_ = 0xffffffffffffffff;
              auVar12._12_4_ = 0xffffffff;
              auVar99 = packssdw(auVar99 ^ auVar12,auVar99 ^ auVar12);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar53[-0x18] = 0xff;
              }
              auVar99 = pshufhw(auVar99,auVar107,0x84);
              auVar23._4_4_ = iVar74;
              auVar23._0_4_ = iVar74;
              auVar23._8_4_ = iVar45;
              auVar23._12_4_ = iVar45;
              auVar101 = pshufhw(auVar92,auVar23,0x84);
              auVar80 = pshufhw(auVar99,auVar115,0x84);
              auVar83._8_4_ = 0xffffffff;
              auVar83._0_8_ = 0xffffffffffffffff;
              auVar83._12_4_ = 0xffffffff;
              auVar83 = (auVar80 | auVar101 & auVar99) ^ auVar83;
              auVar99 = packssdw(auVar83,auVar83);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99._6_2_ >> 8 & 1) != 0) {
                puVar53[-0x1c] = 0xff;
              }
              auVar99 = (auVar97 | auVar32) ^ auVar37;
              auVar93._0_4_ = -(uint)(iVar70 < auVar99._0_4_);
              auVar93._4_4_ = -(uint)(iVar68 < auVar99._4_4_);
              auVar93._8_4_ = -(uint)(iVar57 < auVar99._8_4_);
              auVar93._12_4_ = -(uint)(iVar64 < auVar99._12_4_);
              auVar24._4_4_ = auVar93._0_4_;
              auVar24._0_4_ = auVar93._0_4_;
              auVar24._8_4_ = auVar93._8_4_;
              auVar24._12_4_ = auVar93._8_4_;
              auVar101 = pshuflw(auVar115,auVar24,0xe8);
              auVar84._0_4_ = -(uint)(auVar99._0_4_ == iVar70);
              auVar84._4_4_ = -(uint)(auVar99._4_4_ == iVar68);
              auVar84._8_4_ = -(uint)(auVar99._8_4_ == iVar57);
              auVar84._12_4_ = -(uint)(auVar99._12_4_ == iVar64);
              auVar108._4_4_ = auVar84._4_4_;
              auVar108._0_4_ = auVar84._4_4_;
              auVar108._8_4_ = auVar84._12_4_;
              auVar108._12_4_ = auVar84._12_4_;
              auVar99 = pshuflw(auVar84,auVar108,0xe8);
              auVar109._4_4_ = auVar93._4_4_;
              auVar109._0_4_ = auVar93._4_4_;
              auVar109._8_4_ = auVar93._12_4_;
              auVar109._12_4_ = auVar93._12_4_;
              auVar80 = pshuflw(auVar93,auVar109,0xe8);
              auVar94._8_4_ = 0xffffffff;
              auVar94._0_8_ = 0xffffffffffffffff;
              auVar94._12_4_ = 0xffffffff;
              auVar94 = (auVar80 | auVar99 & auVar101) ^ auVar94;
              auVar80 = packssdw(auVar94,auVar94);
              auVar99 = packsswb(auVar99 & auVar101,auVar80);
              if ((auVar99 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar53[-0x20] = 0xff;
              }
              auVar25._4_4_ = auVar93._0_4_;
              auVar25._0_4_ = auVar93._0_4_;
              auVar25._8_4_ = auVar93._8_4_;
              auVar25._12_4_ = auVar93._8_4_;
              auVar109 = auVar108 & auVar25 | auVar109;
              auVar80 = packssdw(auVar109,auVar109);
              auVar13._8_4_ = 0xffffffff;
              auVar13._0_8_ = 0xffffffffffffffff;
              auVar13._12_4_ = 0xffffffff;
              auVar80 = packssdw(auVar80 ^ auVar13,auVar80 ^ auVar13);
              auVar99 = packsswb(auVar99,auVar80);
              if ((auVar99._8_2_ >> 8 & 1) != 0) {
                puVar53[-0x24] = 0xff;
              }
              auVar99 = (auVar97 | auVar117) ^ auVar37;
              auVar95._0_4_ = -(uint)(iVar70 < auVar99._0_4_);
              auVar95._4_4_ = -(uint)(iVar68 < auVar99._4_4_);
              auVar95._8_4_ = -(uint)(iVar57 < auVar99._8_4_);
              auVar95._12_4_ = -(uint)(iVar64 < auVar99._12_4_);
              auVar110._4_4_ = auVar95._0_4_;
              auVar110._0_4_ = auVar95._0_4_;
              auVar110._8_4_ = auVar95._8_4_;
              auVar110._12_4_ = auVar95._8_4_;
              iVar74 = -(uint)(auVar99._4_4_ == iVar68);
              iVar45 = -(uint)(auVar99._12_4_ == iVar64);
              auVar26._4_4_ = iVar74;
              auVar26._0_4_ = iVar74;
              auVar26._8_4_ = iVar45;
              auVar26._12_4_ = iVar45;
              auVar116._4_4_ = auVar95._4_4_;
              auVar116._0_4_ = auVar95._4_4_;
              auVar116._8_4_ = auVar95._12_4_;
              auVar116._12_4_ = auVar95._12_4_;
              auVar99 = auVar26 & auVar110 | auVar116;
              auVar99 = packssdw(auVar99,auVar99);
              auVar14._8_4_ = 0xffffffff;
              auVar14._0_8_ = 0xffffffffffffffff;
              auVar14._12_4_ = 0xffffffff;
              auVar99 = packssdw(auVar99 ^ auVar14,auVar99 ^ auVar14);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                puVar53[-0x28] = 0xff;
              }
              auVar99 = pshufhw(auVar99,auVar110,0x84);
              auVar27._4_4_ = iVar74;
              auVar27._0_4_ = iVar74;
              auVar27._8_4_ = iVar45;
              auVar27._12_4_ = iVar45;
              auVar101 = pshufhw(auVar95,auVar27,0x84);
              auVar80 = pshufhw(auVar99,auVar116,0x84);
              auVar85._8_4_ = 0xffffffff;
              auVar85._0_8_ = 0xffffffffffffffff;
              auVar85._12_4_ = 0xffffffff;
              auVar85 = (auVar80 | auVar101 & auVar99) ^ auVar85;
              auVar99 = packssdw(auVar85,auVar85);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99._10_2_ >> 8 & 1) != 0) {
                puVar53[-0x2c] = 0xff;
              }
              auVar99 = (auVar97 | _DAT_001520e0) ^ auVar37;
              auVar96._0_4_ = -(uint)(iVar70 < auVar99._0_4_);
              auVar96._4_4_ = -(uint)(iVar68 < auVar99._4_4_);
              auVar96._8_4_ = -(uint)(iVar57 < auVar99._8_4_);
              auVar96._12_4_ = -(uint)(iVar64 < auVar99._12_4_);
              auVar28._4_4_ = auVar96._0_4_;
              auVar28._0_4_ = auVar96._0_4_;
              auVar28._8_4_ = auVar96._8_4_;
              auVar28._12_4_ = auVar96._8_4_;
              auVar101 = pshuflw(auVar116,auVar28,0xe8);
              auVar86._0_4_ = -(uint)(auVar99._0_4_ == iVar70);
              auVar86._4_4_ = -(uint)(auVar99._4_4_ == iVar68);
              auVar86._8_4_ = -(uint)(auVar99._8_4_ == iVar57);
              auVar86._12_4_ = -(uint)(auVar99._12_4_ == iVar64);
              auVar111._4_4_ = auVar86._4_4_;
              auVar111._0_4_ = auVar86._4_4_;
              auVar111._8_4_ = auVar86._12_4_;
              auVar111._12_4_ = auVar86._12_4_;
              auVar99 = pshuflw(auVar86,auVar111,0xe8);
              auVar112._4_4_ = auVar96._4_4_;
              auVar112._0_4_ = auVar96._4_4_;
              auVar112._8_4_ = auVar96._12_4_;
              auVar112._12_4_ = auVar96._12_4_;
              auVar80 = pshuflw(auVar96,auVar112,0xe8);
              auVar15._8_4_ = 0xffffffff;
              auVar15._0_8_ = 0xffffffffffffffff;
              auVar15._12_4_ = 0xffffffff;
              auVar99 = packssdw(auVar99 & auVar101,(auVar80 | auVar99 & auVar101) ^ auVar15);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar53[-0x30] = 0xff;
              }
              auVar29._4_4_ = auVar96._0_4_;
              auVar29._0_4_ = auVar96._0_4_;
              auVar29._8_4_ = auVar96._8_4_;
              auVar29._12_4_ = auVar96._8_4_;
              auVar112 = auVar111 & auVar29 | auVar112;
              auVar80 = packssdw(auVar112,auVar112);
              auVar16._8_4_ = 0xffffffff;
              auVar16._0_8_ = 0xffffffffffffffff;
              auVar16._12_4_ = 0xffffffff;
              auVar99 = packssdw(auVar99,auVar80 ^ auVar16);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99._12_2_ >> 8 & 1) != 0) {
                puVar53[-0x34] = 0xff;
              }
              auVar99 = (auVar97 | _DAT_001520d0) ^ auVar37;
              auVar87._0_4_ = -(uint)(iVar70 < auVar99._0_4_);
              auVar87._4_4_ = -(uint)(iVar68 < auVar99._4_4_);
              auVar87._8_4_ = -(uint)(iVar57 < auVar99._8_4_);
              auVar87._12_4_ = -(uint)(iVar64 < auVar99._12_4_);
              auVar113._4_4_ = auVar87._0_4_;
              auVar113._0_4_ = auVar87._0_4_;
              auVar113._8_4_ = auVar87._8_4_;
              auVar113._12_4_ = auVar87._8_4_;
              auVar98._4_4_ = -(uint)(auVar99._4_4_ == iVar68);
              auVar98._12_4_ = -(uint)(auVar99._12_4_ == iVar64);
              auVar98._0_4_ = auVar98._4_4_;
              auVar98._8_4_ = auVar98._12_4_;
              auVar100._4_4_ = auVar87._4_4_;
              auVar100._0_4_ = auVar87._4_4_;
              auVar100._8_4_ = auVar87._12_4_;
              auVar100._12_4_ = auVar87._12_4_;
              auVar80 = auVar98 & auVar113 | auVar100;
              auVar99 = packssdw(auVar87,auVar80);
              auVar17._8_4_ = 0xffffffff;
              auVar17._0_8_ = 0xffffffffffffffff;
              auVar17._12_4_ = 0xffffffff;
              auVar99 = packssdw(auVar99 ^ auVar17,auVar99 ^ auVar17);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar53[-0x38] = 0xff;
              }
              auVar99 = pshufhw(auVar99,auVar113,0x84);
              in_XMM2 = pshufhw(auVar80,auVar98,0x84);
              in_XMM2 = in_XMM2 & auVar99;
              auVar99 = pshufhw(auVar99,auVar100,0x84);
              auVar88._8_4_ = 0xffffffff;
              auVar88._0_8_ = 0xffffffffffffffff;
              auVar88._12_4_ = 0xffffffff;
              auVar88 = (auVar99 | in_XMM2) ^ auVar88;
              auVar99 = packssdw(auVar88,auVar88);
              in_XMM1 = packsswb(auVar99,auVar99);
              if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                puVar53[-0x3c] = 0xff;
              }
              uVar73 = uVar73 + 0x10;
              puVar53 = puVar53 + -0x40;
            } while ((uVar69 + 0x10 & 0x3ffffff0) != uVar73);
          }
          if ((int)local_88b0 < 1) {
            uVar75 = s->img_x;
          }
          else {
            uVar75 = s->img_x;
            if (0 < (int)sVar43 >> 1) {
              uVar69 = uVar75 * iVar42;
              uVar44 = (sVar43 - 1) * uVar69;
              uVar73 = 0;
              uVar66 = 0;
              do {
                if (0 < (int)uVar69) {
                  uVar71 = 0;
                  do {
                    uVar3 = data_00[uVar71 + uVar73];
                    data_00[uVar71 + uVar73] = data_00[uVar71 + uVar44];
                    data_00[uVar71 + uVar44] = uVar3;
                    uVar71 = uVar71 + 1;
                  } while (uVar69 != uVar71);
                }
                uVar66 = uVar66 + 1;
                uVar44 = uVar44 - uVar69;
                uVar73 = (ulong)((int)uVar73 + uVar69);
              } while (uVar66 != (uint)((int)sVar43 >> 1));
            }
          }
          if ((req_comp == 0) || (iVar42 == req_comp)) {
LAB_00125710:
            *x = uVar75;
            *y = s->img_y;
            if (comp == (int *)0x0) {
              return data_00;
            }
            *comp = s->img_n;
            return data_00;
          }
          data_00 = stbi__convert_format(data_00,iVar42,req_comp,uVar75,sVar43);
          if (data_00 != (uchar *)0x0) {
            uVar75 = s->img_x;
            goto LAB_00125710;
          }
        }
      }
    }
    else {
      if (s->read_from_callbacks != 0) {
        psVar54 = s->buffer_start;
        iVar42 = (*(s->io).read)(s->io_user_data,(char *)psVar54,s->buflen);
        if (iVar42 == 0) {
          s->read_from_callbacks = 0;
          psVar63 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar40 = '\0';
        }
        else {
          psVar63 = psVar54 + iVar42;
          sVar40 = *psVar54;
        }
        s->img_buffer_end = psVar63;
        psVar49 = s->buffer_start + 1;
        s->img_buffer = psVar49;
        goto LAB_00123392;
      }
LAB_00123576:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
LAB_00123586:
      iVar42 = stbi__gif_test(s);
      if (iVar42 != 0) {
        memset(&local_88a8,0,0x8870);
        psVar52 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,psVar60);
        if (psVar52 == (stbi__context *)0x0 || psVar52 == s) {
          if ((stbi__jpeg *)local_88a8.out != (stbi__jpeg *)0x0) {
            free(local_88a8.out);
          }
          psVar52 = (stbi__context *)0x0;
        }
        else {
          *x = local_88a8.w;
          *y = local_88a8.h;
          if ((req_comp & 0xfffffffbU) != 0) {
            psVar52 = (stbi__context *)
                      stbi__convert_format((uchar *)psVar52,4,req_comp,local_88a8.w,local_88a8.h);
          }
        }
        free(local_88a8.history);
        psVar46 = (stbi__jpeg *)local_88a8.background;
        goto LAB_00123aac;
      }
      iVar42 = stbi__psd_test(s);
      if (iVar42 != 0) {
        pvVar50 = stbi__psd_load(s,x,y,comp,req_comp,ri,bpc);
        return pvVar50;
      }
      iVar42 = stbi__pic_test(s);
      if (iVar42 != 0) {
        pvVar50 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
        return pvVar50;
      }
      iVar42 = stbi__pnm_test(s);
      if (iVar42 != 0) {
        pvVar50 = stbi__pnm_load(s,x,y,comp,req_comp,ri_00);
        return pvVar50;
      }
      iVar42 = stbi__hdr_test(s);
      if (iVar42 != 0) {
        data_01 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        psVar60 = stbi__hdr_to_ldr(data_01,*x,*y,req_comp);
        return psVar60;
      }
      iVar42 = stbi__tga_test(s);
      if (iVar42 != 0) {
        pvVar50 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
        return pvVar50;
      }
      stbi__g_failure_reason = "unknown image type";
    }
LAB_00121d5b:
    psVar52 = (stbi__context *)0x0;
  }
  return psVar52;
LAB_00123157:
  bVar78 = false;
LAB_00123159:
  if (!bVar78) goto LAB_00123a92;
LAB_00123166:
  bVar41 = psVar46->marker;
LAB_00123171:
  if (bVar41 == 0xff) {
LAB_0012317e:
    do {
      psVar52 = psVar46->s;
      if ((psVar52->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0012319d:
        if (psVar52->img_buffer_end <= psVar52->img_buffer) goto LAB_00121e50;
      }
      else {
        iVar42 = (*(psVar52->io).eof)(psVar52->io_user_data);
        if (iVar42 != 0) {
          if (psVar52->read_from_callbacks != 0) goto LAB_0012319d;
          goto LAB_00121e50;
        }
      }
      psVar52 = psVar46->s;
      psVar60 = psVar52->img_buffer;
      if (psVar60 < psVar52->img_buffer_end) {
        psVar52->img_buffer = psVar60 + 1;
        sVar40 = *psVar60;
      }
      else {
        if (psVar52->read_from_callbacks == 0) goto LAB_0012317e;
        psVar60 = psVar52->buffer_start;
        iVar42 = (*(psVar52->io).read)(psVar52->io_user_data,(char *)psVar60,psVar52->buflen);
        if (iVar42 == 0) {
          psVar52->read_from_callbacks = 0;
          psVar63 = psVar52->buffer_start + 1;
          psVar52->buffer_start[0] = '\0';
          sVar40 = '\0';
        }
        else {
          psVar63 = psVar60 + iVar42;
          sVar40 = *psVar60;
        }
        psVar52->img_buffer_end = psVar63;
        psVar52->img_buffer = psVar52->buffer_start + 1;
      }
    } while (sVar40 != 0xff);
    psVar52 = psVar46->s;
    psVar60 = psVar52->img_buffer;
    if (psVar60 < psVar52->img_buffer_end) {
      psVar52->img_buffer = psVar60 + 1;
      sVar40 = *psVar60;
    }
    else if (psVar52->read_from_callbacks == 0) {
      sVar40 = '\0';
    }
    else {
      psVar60 = psVar52->buffer_start;
      iVar42 = (*(psVar52->io).read)(psVar52->io_user_data,(char *)psVar60,psVar52->buflen);
      if (iVar42 == 0) {
        psVar52->read_from_callbacks = 0;
        psVar63 = psVar52->buffer_start + 1;
        psVar52->buffer_start[0] = '\0';
        sVar40 = '\0';
      }
      else {
        psVar63 = psVar60 + iVar42;
        sVar40 = *psVar60;
      }
      psVar52->img_buffer_end = psVar63;
      psVar52->img_buffer = psVar52->buffer_start + 1;
    }
    psVar46->marker = sVar40;
  }
LAB_00121e50:
  bVar41 = stbi__get_marker(psVar46);
  goto LAB_00121dfa;
LAB_001250fe:
  paVar59 = (anon_struct_96_18_0d0905d3 *)(ulong)(uVar69 - 0x10);
  psVar46->code_bits = uVar69 - 0x10;
LAB_00125108:
  stbi__g_failure_reason = "bad huffman code";
LAB_00123a8b:
  uVar75 = (uint)paVar59;
  goto LAB_00123a92;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}